

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O2

bool embree::sse2::CurveNiMBIntersectorK<4,4>::
     occluded_n<embree::sse2::OrientedCurve1IntersectorK<embree::BSplineCurveT,4>,embree::sse2::Occluded1KEpilog1<4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  long lVar1;
  long lVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  Primitive *pPVar7;
  undefined4 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  Primitive PVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  undefined4 uVar26;
  undefined4 uVar27;
  Geometry *pGVar28;
  __int_type_conflict _Var29;
  long lVar30;
  long lVar31;
  long lVar32;
  bool bVar33;
  bool bVar34;
  bool bVar35;
  bool bVar36;
  bool bVar37;
  undefined1 auVar38 [12];
  undefined1 auVar39 [12];
  undefined1 auVar40 [12];
  undefined1 auVar41 [12];
  undefined1 auVar42 [12];
  undefined3 uVar43;
  undefined1 auVar44 [12];
  undefined1 auVar45 [12];
  undefined1 auVar46 [15];
  undefined1 auVar47 [15];
  undefined1 auVar48 [15];
  undefined1 auVar49 [15];
  undefined1 auVar50 [15];
  undefined1 auVar51 [15];
  undefined1 auVar52 [15];
  undefined1 auVar53 [15];
  undefined1 auVar54 [15];
  undefined1 auVar55 [15];
  undefined1 auVar56 [15];
  undefined1 auVar57 [15];
  undefined1 auVar58 [15];
  undefined1 auVar59 [15];
  undefined1 auVar60 [15];
  undefined1 auVar61 [15];
  undefined1 auVar62 [15];
  undefined1 auVar63 [15];
  undefined1 auVar64 [15];
  undefined1 auVar65 [15];
  undefined1 auVar66 [15];
  undefined1 auVar67 [15];
  undefined1 auVar68 [15];
  undefined1 auVar69 [15];
  undefined6 uVar70;
  undefined1 auVar71 [12];
  unkbyte9 Var72;
  undefined1 auVar73 [13];
  undefined1 auVar74 [12];
  undefined1 auVar75 [13];
  undefined1 auVar76 [12];
  undefined1 auVar77 [13];
  undefined1 auVar78 [12];
  undefined1 auVar79 [12];
  undefined1 auVar80 [12];
  undefined1 auVar81 [12];
  undefined1 auVar82 [12];
  undefined1 auVar83 [12];
  undefined1 auVar84 [12];
  undefined1 auVar85 [12];
  undefined1 auVar86 [12];
  undefined1 auVar87 [12];
  undefined1 auVar88 [12];
  undefined1 auVar89 [12];
  undefined1 auVar90 [12];
  undefined1 auVar91 [15];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [15];
  undefined1 auVar95 [15];
  bool bVar96;
  bool bVar97;
  undefined1 auVar98 [15];
  undefined1 auVar99 [15];
  undefined1 auVar100 [15];
  undefined1 auVar101 [15];
  undefined1 auVar102 [13];
  undefined1 auVar103 [15];
  bool bVar104;
  byte bVar105;
  uint uVar106;
  ulong uVar107;
  ulong uVar108;
  RTCFilterFunctionN p_Var109;
  RTCRayN *pRVar110;
  byte bVar111;
  long lVar112;
  RayK<4> *pRVar113;
  uint uVar114;
  long lVar115;
  uint uVar116;
  uint uVar117;
  uint uVar118;
  uint uVar119;
  short sVar120;
  undefined2 uVar164;
  float fVar121;
  undefined1 auVar122 [12];
  float fVar165;
  vfloat_impl<4> p00;
  float fVar166;
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar130 [16];
  undefined1 auVar123 [12];
  undefined1 auVar134 [16];
  undefined1 auVar138 [16];
  undefined1 auVar141 [16];
  undefined1 auVar144 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  float fVar167;
  undefined2 uVar199;
  float fVar200;
  undefined2 uVar201;
  float fVar202;
  undefined1 auVar168 [16];
  undefined1 auVar171 [16];
  undefined1 auVar174 [16];
  undefined1 auVar177 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  float fVar203;
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  char cVar204;
  int iVar205;
  float fVar206;
  float fVar207;
  undefined1 auVar209 [12];
  undefined1 auVar210 [12];
  char cVar234;
  int iVar235;
  vfloat4 a_1;
  undefined1 auVar211 [16];
  char cVar239;
  undefined1 auVar215 [16];
  undefined1 auVar219 [16];
  undefined1 auVar223 [16];
  float fVar238;
  float fVar240;
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  float fVar241;
  float fVar242;
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  float fVar243;
  float fVar244;
  float fVar245;
  float fVar253;
  float fVar256;
  undefined1 auVar248 [16];
  float fVar254;
  float fVar255;
  float fVar257;
  float fVar258;
  float fVar259;
  float fVar260;
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  float fVar261;
  float fVar278;
  float fVar279;
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar267 [16];
  float fVar280;
  float fVar281;
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  float fVar282;
  char cVar293;
  float fVar294;
  float fVar296;
  undefined1 auVar283 [16];
  float fVar295;
  float fVar297;
  float fVar298;
  float fVar299;
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  float fVar300;
  float fVar301;
  float fVar303;
  float fVar304;
  float fVar305;
  float fVar306;
  float fVar307;
  float fVar308;
  undefined1 auVar302 [16];
  float fVar309;
  float fVar310;
  float fVar311;
  undefined1 auVar312 [12];
  float fVar326;
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar318 [16];
  float fVar327;
  float fVar328;
  float fVar329;
  float fVar330;
  float fVar331;
  float fVar332;
  float fVar333;
  float fVar334;
  float fVar335;
  float fVar336;
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  float fVar337;
  float fVar347;
  float fVar348;
  undefined1 auVar338 [16];
  undefined1 auVar339 [16];
  undefined1 auVar340 [16];
  undefined1 auVar341 [16];
  undefined1 auVar342 [16];
  undefined1 auVar343 [16];
  undefined1 auVar344 [16];
  undefined1 auVar345 [16];
  undefined1 auVar346 [16];
  float fVar349;
  float fVar350;
  float fVar362;
  float fVar364;
  undefined1 auVar351 [16];
  undefined1 auVar354 [16];
  float fVar363;
  float fVar365;
  float fVar366;
  undefined1 auVar355 [16];
  undefined1 auVar356 [16];
  undefined1 auVar357 [16];
  undefined1 auVar358 [16];
  undefined1 auVar359 [16];
  undefined1 auVar360 [16];
  undefined1 auVar361 [16];
  float fVar367;
  float fVar368;
  float fVar375;
  float fVar376;
  vfloat4 a;
  undefined1 auVar369 [16];
  float fVar377;
  float fVar378;
  float fVar379;
  undefined1 auVar370 [16];
  undefined1 auVar371 [16];
  undefined1 auVar372 [16];
  undefined1 auVar373 [16];
  undefined1 auVar374 [16];
  float fVar380;
  float fVar381;
  float fVar387;
  float fVar390;
  vfloat4 a_2;
  undefined1 auVar382 [16];
  float fVar388;
  float fVar389;
  float fVar391;
  float fVar392;
  float fVar393;
  undefined1 auVar383 [16];
  undefined1 auVar384 [16];
  undefined1 auVar385 [16];
  undefined1 auVar386 [16];
  float fVar394;
  float fVar395;
  float fVar396;
  float fVar397;
  float fVar398;
  float fVar406;
  float fVar407;
  float fVar410;
  float fVar411;
  float fVar414;
  undefined1 auVar399 [16];
  undefined1 auVar400 [16];
  undefined1 auVar401 [16];
  float fVar408;
  float fVar412;
  float fVar415;
  undefined1 auVar402 [16];
  float fVar409;
  float fVar413;
  float fVar416;
  undefined1 auVar403 [16];
  undefined1 auVar404 [16];
  undefined1 auVar405 [16];
  float fVar417;
  float fVar418;
  float fVar419;
  float fVar425;
  float fVar426;
  undefined1 auVar420 [16];
  float fVar427;
  undefined1 auVar423 [16];
  undefined1 auVar424 [16];
  float fVar428;
  float fVar429;
  float fVar430;
  float fVar434;
  float fVar435;
  float fVar436;
  float fVar437;
  undefined1 auVar431 [16];
  undefined1 auVar432 [16];
  undefined1 auVar433 [16];
  float fVar438;
  float fVar439;
  float fVar440;
  float fVar446;
  float fVar449;
  undefined1 auVar441 [16];
  float fVar452;
  undefined1 auVar444 [16];
  float fVar447;
  float fVar448;
  float fVar450;
  float fVar451;
  float fVar453;
  undefined1 auVar445 [16];
  undefined1 local_538 [8];
  float fStack_530;
  float fStack_52c;
  BBox1f local_528;
  undefined1 local_508 [8];
  float fStack_500;
  float fStack_4fc;
  undefined8 local_4f8;
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  vfloat_impl<4> p00_1;
  undefined1 local_3a8 [16];
  undefined1 (*local_398) [16];
  Primitive *local_390;
  float local_388;
  float fStack_384;
  float fStack_380;
  float fStack_37c;
  undefined1 local_378 [16];
  float local_368;
  float fStack_364;
  float fStack_360;
  float fStack_35c;
  undefined1 local_358 [16];
  uint mask_stack [4];
  RTCFilterFunctionNArguments args;
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  undefined1 local_a8 [16];
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  uint local_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint local_68;
  uint uStack_64;
  uint uStack_60;
  uint uStack_5c;
  BBox1f cv_stack [4];
  undefined1 auVar127 [16];
  undefined1 auVar131 [16];
  undefined1 auVar135 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar128 [16];
  undefined1 auVar132 [16];
  undefined1 auVar136 [16];
  undefined1 auVar129 [16];
  undefined1 auVar133 [16];
  undefined1 auVar137 [16];
  undefined1 uVar163;
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar208 [12];
  undefined1 auVar216 [16];
  undefined1 auVar220 [16];
  undefined1 auVar224 [16];
  undefined1 auVar214 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar225 [16];
  int iVar236;
  int iVar237;
  undefined1 auVar246 [12];
  undefined1 auVar249 [16];
  undefined1 auVar247 [16];
  undefined1 auVar250 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar352 [16];
  undefined1 auVar353 [16];
  undefined1 auVar421 [16];
  undefined1 auVar422 [16];
  undefined1 auVar442 [16];
  undefined1 auVar443 [16];
  
  PVar20 = prim[1];
  uVar107 = (ulong)(byte)PVar20;
  lVar112 = uVar107 * 0x25;
  uVar8 = *(undefined4 *)(prim + uVar107 * 4 + 6);
  uVar21 = *(undefined4 *)(prim + uVar107 * 5 + 6);
  uVar22 = *(undefined4 *)(prim + uVar107 * 6 + 6);
  uVar23 = *(undefined4 *)(prim + uVar107 * 0xf + 6);
  uVar24 = *(undefined4 *)(prim + (ulong)(byte)PVar20 * 0x10 + 6);
  uVar25 = *(undefined4 *)(prim + uVar107 * 0x11 + 6);
  uVar26 = *(undefined4 *)(prim + uVar107 * 0x1a + 6);
  uVar27 = *(undefined4 *)(prim + uVar107 * 0x1b + 6);
  pPVar7 = prim + lVar112 + 6;
  fVar410 = *(float *)(pPVar7 + 0xc);
  fVar167 = (*(float *)(ray + k * 4) - *(float *)pPVar7) * fVar410;
  fVar200 = (*(float *)(ray + k * 4 + 0x10) - *(float *)(pPVar7 + 4)) * fVar410;
  fVar202 = (*(float *)(ray + k * 4 + 0x20) - *(float *)(pPVar7 + 8)) * fVar410;
  fVar394 = *(float *)(ray + k * 4 + 0x40) * fVar410;
  fVar406 = *(float *)(ray + k * 4 + 0x50) * fVar410;
  fVar410 = *(float *)(ray + k * 4 + 0x60) * fVar410;
  uVar163 = (undefined1)((uint)uVar21 >> 0x18);
  uVar164 = CONCAT11(uVar163,uVar163);
  uVar163 = (undefined1)((uint)uVar21 >> 0x10);
  uVar9 = CONCAT35(CONCAT21(uVar164,uVar163),CONCAT14(uVar163,uVar21));
  cVar234 = (char)((uint)uVar21 >> 8);
  uVar70 = CONCAT51(CONCAT41((int)((ulong)uVar9 >> 0x20),cVar234),cVar234);
  cVar204 = (char)uVar21;
  uVar108 = CONCAT62(uVar70,CONCAT11(cVar204,cVar204));
  auVar213._8_4_ = 0;
  auVar213._0_8_ = uVar108;
  auVar213._12_2_ = uVar164;
  auVar213._14_2_ = uVar164;
  uVar164 = (undefined2)((ulong)uVar9 >> 0x20);
  auVar212._12_4_ = auVar213._12_4_;
  auVar212._8_2_ = 0;
  auVar212._0_8_ = uVar108;
  auVar212._10_2_ = uVar164;
  auVar211._10_6_ = auVar212._10_6_;
  auVar211._8_2_ = uVar164;
  auVar211._0_8_ = uVar108;
  uVar164 = (undefined2)uVar70;
  auVar71._4_8_ = auVar211._8_8_;
  auVar71._2_2_ = uVar164;
  auVar71._0_2_ = uVar164;
  iVar205 = (int)CONCAT11(cVar204,cVar204) >> 8;
  iVar235 = auVar71._0_4_ >> 0x18;
  auVar208._0_8_ = CONCAT44(iVar235,iVar205);
  auVar208._8_4_ = auVar211._8_4_ >> 0x18;
  auVar214._12_4_ = auVar212._12_4_ >> 0x18;
  auVar214._0_12_ = auVar208;
  fVar303 = (float)iVar235;
  cVar239 = cVar234 >> 7;
  auVar46[0xd] = 0;
  auVar46._0_13_ = auVar214._0_13_;
  auVar46[0xe] = cVar239;
  auVar49[0xc] = cVar239;
  auVar49._0_12_ = auVar208;
  auVar49._13_2_ = auVar46._13_2_;
  auVar52[0xb] = 0;
  auVar52._0_11_ = auVar208._0_11_;
  auVar52._12_3_ = auVar49._12_3_;
  auVar55[10] = cVar239;
  auVar55._0_10_ = auVar208._0_10_;
  auVar55._11_4_ = auVar52._11_4_;
  auVar58[9] = 0;
  auVar58._0_9_ = auVar208._0_9_;
  auVar58._10_5_ = auVar55._10_5_;
  auVar61[8] = cVar234;
  auVar61._0_8_ = auVar208._0_8_;
  auVar61._9_6_ = auVar58._9_6_;
  Var72 = CONCAT81(CONCAT71(auVar61._8_7_,(char)((uint)uVar22 >> 0x18)),(short)cVar204 >> 7);
  auVar64._6_9_ = Var72;
  auVar64[5] = (char)((uint)uVar22 >> 0x10);
  auVar64[4] = (undefined1)((short)cVar204 >> 7);
  auVar64._0_4_ = iVar205;
  cVar239 = (char)((uint)uVar22 >> 8);
  auVar73._2_11_ = auVar64._4_11_;
  auVar73[1] = cVar239;
  auVar73[0] = (undefined1)((short)cVar204 >> 7);
  cVar234 = (char)uVar22;
  auVar67._2_13_ = auVar73;
  auVar67._0_2_ = CONCAT11(cVar234,cVar204);
  uVar164 = (undefined2)Var72;
  auVar217._0_12_ = auVar67._0_12_;
  auVar217._12_2_ = uVar164;
  auVar217._14_2_ = uVar164;
  auVar216._12_4_ = auVar217._12_4_;
  auVar216._0_10_ = auVar67._0_10_;
  auVar216._10_2_ = auVar64._4_2_;
  auVar215._10_6_ = auVar216._10_6_;
  auVar215._0_8_ = auVar67._0_8_;
  auVar215._8_2_ = auVar64._4_2_;
  auVar74._4_8_ = auVar215._8_8_;
  auVar74._2_2_ = auVar73._0_2_;
  auVar74._0_2_ = auVar73._0_2_;
  iVar235 = (int)CONCAT11(cVar234,cVar204) >> 8;
  iVar236 = auVar74._0_4_ >> 0x18;
  auVar209._0_8_ = CONCAT44(iVar236,iVar235);
  auVar209._8_4_ = auVar215._8_4_ >> 0x18;
  auVar218._12_4_ = auVar216._12_4_ >> 0x18;
  auVar218._0_12_ = auVar209;
  fVar387 = (float)iVar236;
  cVar204 = cVar239 >> 7;
  auVar47[0xd] = 0;
  auVar47._0_13_ = auVar218._0_13_;
  auVar47[0xe] = cVar204;
  auVar50[0xc] = cVar204;
  auVar50._0_12_ = auVar209;
  auVar50._13_2_ = auVar47._13_2_;
  auVar53[0xb] = 0;
  auVar53._0_11_ = auVar209._0_11_;
  auVar53._12_3_ = auVar50._12_3_;
  auVar56[10] = cVar204;
  auVar56._0_10_ = auVar209._0_10_;
  auVar56._11_4_ = auVar53._11_4_;
  auVar59[9] = 0;
  auVar59._0_9_ = auVar209._0_9_;
  auVar59._10_5_ = auVar56._10_5_;
  auVar62[8] = cVar239;
  auVar62._0_8_ = auVar209._0_8_;
  auVar62._9_6_ = auVar59._9_6_;
  Var72 = CONCAT81(CONCAT71(auVar62._8_7_,(char)((uint)uVar24 >> 0x18)),(short)cVar234 >> 7);
  auVar65._6_9_ = Var72;
  auVar65[5] = (char)((uint)uVar24 >> 0x10);
  auVar65[4] = (undefined1)((short)cVar234 >> 7);
  auVar65._0_4_ = iVar235;
  cVar293 = (char)((uint)uVar24 >> 8);
  auVar75._2_11_ = auVar65._4_11_;
  auVar75[1] = cVar293;
  auVar75[0] = (undefined1)((short)cVar234 >> 7);
  cVar239 = (char)uVar24;
  auVar68._2_13_ = auVar75;
  auVar68._0_2_ = CONCAT11(cVar239,cVar234);
  uVar164 = (undefined2)Var72;
  auVar221._0_12_ = auVar68._0_12_;
  auVar221._12_2_ = uVar164;
  auVar221._14_2_ = uVar164;
  auVar220._12_4_ = auVar221._12_4_;
  auVar220._0_10_ = auVar68._0_10_;
  auVar220._10_2_ = auVar65._4_2_;
  auVar219._10_6_ = auVar220._10_6_;
  auVar219._0_8_ = auVar68._0_8_;
  auVar219._8_2_ = auVar65._4_2_;
  auVar76._4_8_ = auVar219._8_8_;
  auVar76._2_2_ = auVar75._0_2_;
  auVar76._0_2_ = auVar75._0_2_;
  iVar236 = (int)CONCAT11(cVar239,cVar234) >> 8;
  iVar237 = auVar76._0_4_ >> 0x18;
  auVar210._0_8_ = CONCAT44(iVar237,iVar236);
  auVar210._8_4_ = auVar219._8_4_ >> 0x18;
  auVar222._12_4_ = auVar220._12_4_ >> 0x18;
  auVar222._0_12_ = auVar210;
  fVar326 = (float)iVar237;
  cVar204 = cVar293 >> 7;
  auVar48[0xd] = 0;
  auVar48._0_13_ = auVar222._0_13_;
  auVar48[0xe] = cVar204;
  auVar51[0xc] = cVar204;
  auVar51._0_12_ = auVar210;
  auVar51._13_2_ = auVar48._13_2_;
  auVar54[0xb] = 0;
  auVar54._0_11_ = auVar210._0_11_;
  auVar54._12_3_ = auVar51._12_3_;
  auVar57[10] = cVar204;
  auVar57._0_10_ = auVar210._0_10_;
  auVar57._11_4_ = auVar54._11_4_;
  auVar60[9] = 0;
  auVar60._0_9_ = auVar210._0_9_;
  auVar60._10_5_ = auVar57._10_5_;
  auVar63[8] = cVar293;
  auVar63._0_8_ = auVar210._0_8_;
  auVar63._9_6_ = auVar60._9_6_;
  Var72 = CONCAT81(CONCAT71(auVar63._8_7_,(char)((uint)uVar25 >> 0x18)),(short)cVar239 >> 7);
  auVar66._6_9_ = Var72;
  auVar66[5] = (char)((uint)uVar25 >> 0x10);
  auVar66[4] = (undefined1)((short)cVar239 >> 7);
  auVar66._0_4_ = iVar236;
  auVar77._2_11_ = auVar66._4_11_;
  auVar77[1] = (char)((uint)uVar25 >> 8);
  auVar77[0] = (undefined1)((short)cVar239 >> 7);
  sVar120 = CONCAT11((char)uVar25,cVar239);
  auVar69._2_13_ = auVar77;
  auVar69._0_2_ = sVar120;
  uVar164 = (undefined2)Var72;
  auVar225._0_12_ = auVar69._0_12_;
  auVar225._12_2_ = uVar164;
  auVar225._14_2_ = uVar164;
  auVar224._12_4_ = auVar225._12_4_;
  auVar224._0_10_ = auVar69._0_10_;
  auVar224._10_2_ = auVar66._4_2_;
  auVar223._10_6_ = auVar224._10_6_;
  auVar223._0_8_ = auVar69._0_8_;
  auVar223._8_2_ = auVar66._4_2_;
  auVar78._4_8_ = auVar223._8_8_;
  auVar78._2_2_ = auVar77._0_2_;
  auVar78._0_2_ = auVar77._0_2_;
  fVar337 = (float)((int)sVar120 >> 8);
  fVar347 = (float)(auVar78._0_4_ >> 0x18);
  fVar348 = (float)(auVar223._8_4_ >> 0x18);
  uVar21 = *(undefined4 *)(prim + uVar107 * 0x1c + 6);
  fVar243 = fVar410 * fVar337;
  fVar253 = fVar410 * fVar347;
  auVar246._0_8_ = CONCAT44(fVar253,fVar243);
  auVar246._8_4_ = fVar410 * fVar348;
  auVar247._12_4_ = fVar410 * (float)(auVar224._12_4_ >> 0x18);
  auVar247._0_12_ = auVar246;
  fVar206 = (*(float *)(ray + k * 4 + 0x70) - *(float *)(prim + lVar112 + 0x16)) *
            *(float *)(prim + lVar112 + 0x1a);
  local_538[0] = (undefined1)uVar8;
  local_538[1] = (undefined1)((uint)uVar8 >> 8);
  local_538[2] = (undefined1)((uint)uVar8 >> 0x10);
  local_538[3] = (undefined1)((uint)uVar8 >> 0x18);
  auVar91[0xd] = 0;
  auVar91._0_13_ = auVar247._0_13_;
  auVar91[0xe] = (char)((uint)fVar253 >> 0x18);
  auVar94[0xc] = (char)((uint)fVar253 >> 0x10);
  auVar94._0_12_ = auVar246;
  auVar94._13_2_ = auVar91._13_2_;
  auVar95[0xb] = 0;
  auVar95._0_11_ = auVar246._0_11_;
  auVar95._12_3_ = auVar94._12_3_;
  auVar98[10] = (char)((uint)fVar253 >> 8);
  auVar98._0_10_ = auVar246._0_10_;
  auVar98._11_4_ = auVar95._11_4_;
  auVar99[9] = 0;
  auVar99._0_9_ = auVar246._0_9_;
  auVar99._10_5_ = auVar98._10_5_;
  auVar100[8] = SUB41(fVar253,0);
  auVar100._0_8_ = auVar246._0_8_;
  auVar100._9_6_ = auVar99._9_6_;
  Var72 = CONCAT81(CONCAT71(auVar100._8_7_,local_538[3]),(char)((uint)fVar243 >> 0x18));
  auVar101._6_9_ = Var72;
  auVar101[5] = local_538[2];
  auVar101[4] = (char)((uint)fVar243 >> 0x10);
  auVar101._0_4_ = fVar243;
  auVar102._2_11_ = auVar101._4_11_;
  auVar102[1] = local_538[1];
  auVar102[0] = (char)((uint)fVar243 >> 8);
  sVar120 = CONCAT11(local_538[0],SUB41(fVar243,0));
  auVar103._2_13_ = auVar102;
  auVar103._0_2_ = sVar120;
  uVar164 = (undefined2)Var72;
  auVar250._0_12_ = auVar103._0_12_;
  auVar250._12_2_ = uVar164;
  auVar250._14_2_ = uVar164;
  auVar249._12_4_ = auVar250._12_4_;
  auVar249._0_10_ = auVar103._0_10_;
  auVar249._10_2_ = auVar101._4_2_;
  auVar248._10_6_ = auVar249._10_6_;
  auVar248._0_8_ = auVar103._0_8_;
  auVar248._8_2_ = auVar101._4_2_;
  auVar79._4_8_ = auVar248._8_8_;
  auVar79._2_2_ = auVar102._0_2_;
  auVar79._0_2_ = auVar102._0_2_;
  fVar244 = (float)((int)sVar120 >> 8);
  fVar254 = (float)(auVar79._0_4_ >> 0x18);
  fVar256 = (float)(auVar248._8_4_ >> 0x18);
  uVar163 = (undefined1)((uint)uVar23 >> 0x18);
  uVar164 = CONCAT11(uVar163,uVar163);
  uVar163 = (undefined1)((uint)uVar23 >> 0x10);
  uVar9 = CONCAT35(CONCAT21(uVar164,uVar163),CONCAT14(uVar163,uVar23));
  uVar163 = (undefined1)((uint)uVar23 >> 8);
  uVar70 = CONCAT51(CONCAT41((int)((ulong)uVar9 >> 0x20),uVar163),uVar163);
  sVar120 = CONCAT11((char)uVar23,(char)uVar23);
  uVar108 = CONCAT62(uVar70,sVar120);
  auVar125._8_4_ = 0;
  auVar125._0_8_ = uVar108;
  auVar125._12_2_ = uVar164;
  auVar125._14_2_ = uVar164;
  uVar164 = (undefined2)((ulong)uVar9 >> 0x20);
  auVar262._12_4_ = auVar125._12_4_;
  auVar262._8_2_ = 0;
  auVar262._0_8_ = uVar108;
  auVar262._10_2_ = uVar164;
  auVar184._10_6_ = auVar262._10_6_;
  auVar184._8_2_ = uVar164;
  auVar184._0_8_ = uVar108;
  uVar164 = (undefined2)uVar70;
  auVar80._4_8_ = auVar184._8_8_;
  auVar80._2_2_ = uVar164;
  auVar80._0_2_ = uVar164;
  fVar207 = (float)((int)sVar120 >> 8);
  fVar238 = (float)(auVar80._0_4_ >> 0x18);
  fVar240 = (float)(auVar184._8_4_ >> 0x18);
  uVar163 = (undefined1)((uint)uVar26 >> 0x18);
  uVar164 = CONCAT11(uVar163,uVar163);
  uVar163 = (undefined1)((uint)uVar26 >> 0x10);
  uVar9 = CONCAT35(CONCAT21(uVar164,uVar163),CONCAT14(uVar163,uVar26));
  uVar163 = (undefined1)((uint)uVar26 >> 8);
  uVar70 = CONCAT51(CONCAT41((int)((ulong)uVar9 >> 0x20),uVar163),uVar163);
  sVar120 = CONCAT11((char)uVar26,(char)uVar26);
  uVar108 = CONCAT62(uVar70,sVar120);
  auVar422._8_4_ = 0;
  auVar422._0_8_ = uVar108;
  auVar422._12_2_ = uVar164;
  auVar422._14_2_ = uVar164;
  uVar164 = (undefined2)((ulong)uVar9 >> 0x20);
  auVar421._12_4_ = auVar422._12_4_;
  auVar421._8_2_ = 0;
  auVar421._0_8_ = uVar108;
  auVar421._10_2_ = uVar164;
  auVar420._10_6_ = auVar421._10_6_;
  auVar420._8_2_ = uVar164;
  auVar420._0_8_ = uVar108;
  uVar164 = (undefined2)uVar70;
  auVar81._4_8_ = auVar420._8_8_;
  auVar81._2_2_ = uVar164;
  auVar81._0_2_ = uVar164;
  fVar417 = (float)((int)sVar120 >> 8);
  fVar425 = (float)(auVar81._0_4_ >> 0x18);
  fVar426 = (float)(auVar420._8_4_ >> 0x18);
  uVar163 = (undefined1)((uint)uVar27 >> 0x18);
  uVar164 = CONCAT11(uVar163,uVar163);
  uVar163 = (undefined1)((uint)uVar27 >> 0x10);
  uVar9 = CONCAT35(CONCAT21(uVar164,uVar163),CONCAT14(uVar163,uVar27));
  uVar163 = (undefined1)((uint)uVar27 >> 8);
  uVar70 = CONCAT51(CONCAT41((int)((ulong)uVar9 >> 0x20),uVar163),uVar163);
  sVar120 = CONCAT11((char)uVar27,(char)uVar27);
  uVar108 = CONCAT62(uVar70,sVar120);
  auVar353._8_4_ = 0;
  auVar353._0_8_ = uVar108;
  auVar353._12_2_ = uVar164;
  auVar353._14_2_ = uVar164;
  uVar164 = (undefined2)((ulong)uVar9 >> 0x20);
  auVar352._12_4_ = auVar353._12_4_;
  auVar352._8_2_ = 0;
  auVar352._0_8_ = uVar108;
  auVar352._10_2_ = uVar164;
  auVar351._10_6_ = auVar352._10_6_;
  auVar351._8_2_ = uVar164;
  auVar351._0_8_ = uVar108;
  uVar164 = (undefined2)uVar70;
  auVar82._4_8_ = auVar351._8_8_;
  auVar82._2_2_ = uVar164;
  auVar82._0_2_ = uVar164;
  fVar349 = (float)((int)sVar120 >> 8);
  fVar362 = (float)(auVar82._0_4_ >> 0x18);
  fVar364 = (float)(auVar351._8_4_ >> 0x18);
  uVar163 = (undefined1)((uint)uVar21 >> 0x18);
  uVar164 = CONCAT11(uVar163,uVar163);
  uVar163 = (undefined1)((uint)uVar21 >> 0x10);
  uVar9 = CONCAT35(CONCAT21(uVar164,uVar163),CONCAT14(uVar163,uVar21));
  uVar163 = (undefined1)((uint)uVar21 >> 8);
  uVar70 = CONCAT51(CONCAT41((int)((ulong)uVar9 >> 0x20),uVar163),uVar163);
  sVar120 = CONCAT11((char)uVar21,(char)uVar21);
  uVar108 = CONCAT62(uVar70,sVar120);
  auVar443._8_4_ = 0;
  auVar443._0_8_ = uVar108;
  auVar443._12_2_ = uVar164;
  auVar443._14_2_ = uVar164;
  uVar164 = (undefined2)((ulong)uVar9 >> 0x20);
  auVar442._12_4_ = auVar443._12_4_;
  auVar442._8_2_ = 0;
  auVar442._0_8_ = uVar108;
  auVar442._10_2_ = uVar164;
  auVar441._10_6_ = auVar442._10_6_;
  auVar441._8_2_ = uVar164;
  auVar441._0_8_ = uVar108;
  uVar164 = (undefined2)uVar70;
  auVar83._4_8_ = auVar441._8_8_;
  auVar83._2_2_ = uVar164;
  auVar83._0_2_ = uVar164;
  fVar121 = (float)((int)sVar120 >> 8);
  fVar165 = (float)(auVar83._0_4_ >> 0x18);
  fVar166 = (float)(auVar441._8_4_ >> 0x18);
  fVar438 = fVar394 * fVar244 + fVar406 * (float)iVar205 + fVar410 * (float)iVar235;
  fVar446 = fVar394 * fVar254 + fVar406 * fVar303 + fVar410 * fVar387;
  fVar449 = fVar394 * fVar256 + fVar406 * (float)auVar208._8_4_ + fVar410 * (float)auVar209._8_4_;
  fVar452 = fVar394 * (float)(auVar249._12_4_ >> 0x18) +
            fVar406 * (float)auVar214._12_4_ + fVar410 * (float)auVar218._12_4_;
  fVar395 = fVar394 * fVar207 + fVar406 * (float)iVar236 + fVar243;
  fVar407 = fVar394 * fVar238 + fVar406 * fVar326 + fVar253;
  fVar411 = fVar394 * fVar240 + fVar406 * (float)auVar210._8_4_ + auVar246._8_4_;
  fVar414 = fVar394 * (float)(auVar262._12_4_ >> 0x18) +
            fVar406 * (float)auVar222._12_4_ + auVar247._12_4_;
  fVar243 = fVar394 * fVar417 + fVar406 * fVar349 + fVar410 * fVar121;
  fVar253 = fVar394 * fVar425 + fVar406 * fVar362 + fVar410 * fVar165;
  fVar296 = fVar394 * fVar426 + fVar406 * fVar364 + fVar410 * fVar166;
  fVar394 = fVar394 * (float)(auVar421._12_4_ >> 0x18) +
            fVar406 * (float)(auVar352._12_4_ >> 0x18) + fVar410 * (float)(auVar442._12_4_ >> 0x18);
  uVar9 = *(undefined8 *)(prim + uVar107 * 7 + 6);
  uVar10 = *(undefined8 *)(prim + uVar107 * 0xb + 6);
  uVar11 = *(undefined8 *)(prim + uVar107 * 9 + 6);
  uVar12 = *(undefined8 *)(prim + uVar107 * 0xd + 6);
  uVar108 = *(ulong *)(prim + uVar107 * 0x12 + 6);
  fVar406 = fVar244 * fVar167 + (float)iVar205 * fVar200 + (float)iVar235 * fVar202;
  fVar387 = fVar254 * fVar167 + fVar303 * fVar200 + fVar387 * fVar202;
  fVar257 = fVar256 * fVar167 + (float)auVar208._8_4_ * fVar200 + (float)auVar209._8_4_ * fVar202;
  fVar259 = (float)(auVar249._12_4_ >> 0x18) * fVar167 +
            (float)auVar214._12_4_ * fVar200 + (float)auVar218._12_4_ * fVar202;
  fVar303 = fVar207 * fVar167 + (float)iVar236 * fVar200 + fVar337 * fVar202;
  fVar326 = fVar238 * fVar167 + fVar326 * fVar200 + fVar347 * fVar202;
  fVar337 = fVar240 * fVar167 + (float)auVar210._8_4_ * fVar200 + fVar348 * fVar202;
  fVar347 = (float)(auVar262._12_4_ >> 0x18) * fVar167 +
            (float)auVar222._12_4_ * fVar200 + (float)(auVar224._12_4_ >> 0x18) * fVar202;
  fVar417 = fVar167 * fVar417 + fVar200 * fVar349 + fVar202 * fVar121;
  fVar425 = fVar167 * fVar425 + fVar200 * fVar362 + fVar202 * fVar165;
  fVar426 = fVar167 * fVar426 + fVar200 * fVar364 + fVar202 * fVar166;
  fVar436 = fVar167 * (float)(auVar421._12_4_ >> 0x18) +
            fVar200 * (float)(auVar352._12_4_ >> 0x18) + fVar202 * (float)(auVar442._12_4_ >> 0x18);
  fVar410 = (float)DAT_01f4bd50;
  fVar121 = DAT_01f4bd50._4_4_;
  fVar165 = DAT_01f4bd50._8_4_;
  fVar166 = DAT_01f4bd50._12_4_;
  uVar116 = -(uint)(fVar410 <= ABS(fVar438));
  uVar117 = -(uint)(fVar121 <= ABS(fVar446));
  uVar118 = -(uint)(fVar165 <= ABS(fVar449));
  uVar119 = -(uint)(fVar166 <= ABS(fVar452));
  auVar444._0_4_ = (uint)fVar438 & uVar116;
  auVar444._4_4_ = (uint)fVar446 & uVar117;
  auVar444._8_4_ = (uint)fVar449 & uVar118;
  auVar444._12_4_ = (uint)fVar452 & uVar119;
  auVar124._0_4_ = ~uVar116 & (uint)fVar410;
  auVar124._4_4_ = ~uVar117 & (uint)fVar121;
  auVar124._8_4_ = ~uVar118 & (uint)fVar165;
  auVar124._12_4_ = ~uVar119 & (uint)fVar166;
  auVar124 = auVar124 | auVar444;
  uVar116 = -(uint)(fVar410 <= ABS(fVar395));
  uVar117 = -(uint)(fVar121 <= ABS(fVar407));
  uVar118 = -(uint)(fVar165 <= ABS(fVar411));
  uVar119 = -(uint)(fVar166 <= ABS(fVar414));
  auVar399._0_4_ = (uint)fVar395 & uVar116;
  auVar399._4_4_ = (uint)fVar407 & uVar117;
  auVar399._8_4_ = (uint)fVar411 & uVar118;
  auVar399._12_4_ = (uint)fVar414 & uVar119;
  auVar313._0_4_ = ~uVar116 & (uint)fVar410;
  auVar313._4_4_ = ~uVar117 & (uint)fVar121;
  auVar313._8_4_ = ~uVar118 & (uint)fVar165;
  auVar313._12_4_ = ~uVar119 & (uint)fVar166;
  auVar313 = auVar313 | auVar399;
  uVar116 = -(uint)(fVar410 <= ABS(fVar243));
  uVar117 = -(uint)(fVar121 <= ABS(fVar253));
  uVar118 = -(uint)(fVar165 <= ABS(fVar296));
  uVar119 = -(uint)(fVar166 <= ABS(fVar394));
  auVar283._0_4_ = (uint)fVar243 & uVar116;
  auVar283._4_4_ = (uint)fVar253 & uVar117;
  auVar283._8_4_ = (uint)fVar296 & uVar118;
  auVar283._12_4_ = (uint)fVar394 & uVar119;
  auVar400._0_4_ = ~uVar116 & (uint)fVar410;
  auVar400._4_4_ = ~uVar117 & (uint)fVar121;
  auVar400._8_4_ = ~uVar118 & (uint)fVar165;
  auVar400._12_4_ = ~uVar119 & (uint)fVar166;
  auVar400 = auVar400 | auVar283;
  auVar262 = rcpps(_DAT_01f4bd50,auVar124);
  auVar263._0_4_ = auVar262._0_4_;
  auVar356._0_4_ = auVar124._0_4_ * auVar263._0_4_;
  fVar348 = auVar262._4_4_;
  auVar356._4_4_ = auVar124._4_4_ * fVar348;
  fVar349 = auVar262._8_4_;
  auVar356._8_4_ = auVar124._8_4_ * fVar349;
  fVar362 = auVar262._12_4_;
  auVar356._12_4_ = auVar124._12_4_ * fVar362;
  fVar395 = (1.0 - auVar356._0_4_) * auVar263._0_4_ + auVar263._0_4_;
  fVar348 = (1.0 - auVar356._4_4_) * fVar348 + fVar348;
  fVar349 = (1.0 - auVar356._8_4_) * fVar349 + fVar349;
  fVar362 = (1.0 - auVar356._12_4_) * fVar362 + fVar362;
  auVar125 = rcpps(auVar356,auVar313);
  fVar410 = auVar125._0_4_;
  auVar314._0_4_ = auVar313._0_4_ * fVar410;
  fVar121 = auVar125._4_4_;
  fVar200 = auVar313._4_4_ * fVar121;
  auVar312._0_8_ = CONCAT44(fVar200,auVar314._0_4_);
  fVar240 = auVar125._8_4_;
  auVar312._8_4_ = auVar313._8_4_ * fVar240;
  fVar296 = auVar125._12_4_;
  fVar410 = (1.0 - auVar314._0_4_) * fVar410 + fVar410;
  fVar121 = (1.0 - fVar200) * fVar121 + fVar121;
  fVar240 = (1.0 - auVar312._8_4_) * fVar240 + fVar240;
  fVar296 = (1.0 - auVar313._12_4_ * fVar296) * fVar296 + fVar296;
  auVar125 = rcpps(auVar125,auVar400);
  auVar126._0_4_ = auVar125._0_4_;
  fVar165 = auVar125._4_4_;
  fVar243 = auVar125._8_4_;
  fVar394 = auVar125._12_4_;
  uVar13 = *(undefined8 *)(prim + uVar107 * 0x16 + 6);
  fVar364 = (1.0 - auVar400._0_4_ * auVar126._0_4_) * auVar126._0_4_ + auVar126._0_4_;
  fVar165 = (1.0 - auVar400._4_4_ * fVar165) * fVar165 + fVar165;
  fVar243 = (1.0 - auVar400._8_4_ * fVar243) * fVar243 + fVar243;
  fVar394 = (1.0 - auVar400._12_4_ * fVar394) * fVar394 + fVar394;
  local_528.lower._0_2_ = (short)uVar9;
  local_528.lower._2_2_ = (undefined2)((ulong)uVar9 >> 0x10);
  local_528.upper._0_2_ = (undefined2)((ulong)uVar9 >> 0x20);
  local_528.upper._2_2_ = (undefined2)((ulong)uVar9 >> 0x30);
  auVar129._0_12_ = auVar125._0_12_;
  auVar129._12_2_ = auVar125._6_2_;
  auVar129._14_2_ = local_528.upper._2_2_;
  auVar128._12_4_ = auVar129._12_4_;
  auVar128._0_10_ = auVar125._0_10_;
  auVar128._10_2_ = local_528.upper._0_2_;
  auVar127._10_6_ = auVar128._10_6_;
  auVar127._0_8_ = auVar125._0_8_;
  auVar127._8_2_ = auVar125._4_2_;
  auVar126._8_8_ = auVar127._8_8_;
  auVar126._6_2_ = local_528.lower._2_2_;
  auVar126._4_2_ = auVar125._2_2_;
  auVar130._0_4_ = (float)(int)local_528.lower._0_2_;
  fVar166 = (float)(auVar126._4_4_ >> 0x10);
  auVar122._0_8_ = CONCAT44(fVar166,auVar130._0_4_);
  auVar122._8_4_ = (float)(auVar127._8_4_ >> 0x10);
  auVar266._0_12_ = auVar262._0_12_;
  auVar266._12_2_ = auVar262._6_2_;
  auVar266._14_2_ = (short)((ulong)uVar10 >> 0x30);
  auVar265._12_4_ = auVar266._12_4_;
  auVar265._0_10_ = auVar262._0_10_;
  auVar265._10_2_ = (short)((ulong)uVar10 >> 0x20);
  auVar264._10_6_ = auVar265._10_6_;
  auVar264._0_8_ = auVar262._0_8_;
  auVar264._8_2_ = auVar262._4_2_;
  auVar263._8_8_ = auVar264._8_8_;
  auVar263._6_2_ = (short)((ulong)uVar10 >> 0x10);
  auVar263._4_2_ = auVar262._2_2_;
  auVar133._12_2_ = (short)((uint)fVar166 >> 0x10);
  auVar133._0_12_ = auVar122;
  auVar133._14_2_ = (short)((ulong)uVar11 >> 0x30);
  auVar132._12_4_ = auVar133._12_4_;
  auVar132._0_10_ = auVar122._0_10_;
  auVar132._10_2_ = (short)((ulong)uVar11 >> 0x20);
  auVar131._10_6_ = auVar132._10_6_;
  auVar131._8_2_ = SUB42(fVar166,0);
  auVar131._0_8_ = auVar122._0_8_;
  auVar130._8_8_ = auVar131._8_8_;
  auVar130._6_2_ = (short)((ulong)uVar11 >> 0x10);
  auVar130._4_2_ = (short)((uint)auVar130._0_4_ >> 0x10);
  auVar134._0_4_ = (float)(int)(short)uVar11;
  fVar167 = (float)(auVar130._4_4_ >> 0x10);
  auVar123._0_8_ = CONCAT44(fVar167,auVar134._0_4_);
  auVar123._8_4_ = (float)(auVar131._8_4_ >> 0x10);
  auVar317._12_2_ = (short)((uint)fVar200 >> 0x10);
  auVar317._0_12_ = auVar312;
  auVar317._14_2_ = (short)((ulong)uVar12 >> 0x30);
  auVar316._12_4_ = auVar317._12_4_;
  auVar316._0_10_ = auVar312._0_10_;
  auVar316._10_2_ = (short)((ulong)uVar12 >> 0x20);
  auVar315._10_6_ = auVar316._10_6_;
  auVar315._8_2_ = SUB42(fVar200,0);
  auVar315._0_8_ = auVar312._0_8_;
  auVar314._8_8_ = auVar315._8_8_;
  auVar314._6_2_ = (short)((ulong)uVar12 >> 0x10);
  auVar314._4_2_ = (short)((uint)auVar314._0_4_ >> 0x10);
  uVar201 = (undefined2)(uVar108 >> 0x30);
  auVar137._12_2_ = (short)((uint)fVar167 >> 0x10);
  auVar137._0_12_ = auVar123;
  auVar137._14_2_ = uVar201;
  auVar136._12_4_ = auVar137._12_4_;
  auVar136._0_10_ = auVar123._0_10_;
  uVar199 = (undefined2)(uVar108 >> 0x20);
  auVar136._10_2_ = uVar199;
  auVar135._10_6_ = auVar136._10_6_;
  auVar135._8_2_ = SUB42(fVar167,0);
  auVar135._0_8_ = auVar123._0_8_;
  auVar134._8_8_ = auVar135._8_8_;
  uVar164 = (undefined2)(uVar108 >> 0x10);
  auVar134._6_2_ = uVar164;
  auVar134._4_2_ = (short)((uint)auVar134._0_4_ >> 0x10);
  fVar200 = (float)(auVar134._4_4_ >> 0x10);
  fVar244 = (float)(auVar135._8_4_ >> 0x10);
  auVar170._8_4_ = 0;
  auVar170._0_8_ = uVar108;
  auVar170._12_2_ = uVar201;
  auVar170._14_2_ = (short)((ulong)uVar13 >> 0x30);
  auVar169._12_4_ = auVar170._12_4_;
  auVar169._8_2_ = 0;
  auVar169._0_8_ = uVar108;
  auVar169._10_2_ = (short)((ulong)uVar13 >> 0x20);
  auVar168._10_6_ = auVar169._10_6_;
  auVar168._8_2_ = uVar199;
  auVar168._0_8_ = uVar108;
  auVar84._4_8_ = auVar168._8_8_;
  auVar84._2_2_ = (short)((ulong)uVar13 >> 0x10);
  auVar84._0_2_ = uVar164;
  uVar14 = *(ulong *)(prim + uVar107 * 0x14 + 6);
  uVar164 = (undefined2)(uVar14 >> 0x30);
  auVar140._8_4_ = 0;
  auVar140._0_8_ = uVar14;
  auVar140._12_2_ = uVar164;
  auVar140._14_2_ = uVar164;
  uVar164 = (undefined2)(uVar14 >> 0x20);
  auVar139._12_4_ = auVar140._12_4_;
  auVar139._8_2_ = 0;
  auVar139._0_8_ = uVar14;
  auVar139._10_2_ = uVar164;
  auVar138._10_6_ = auVar139._10_6_;
  auVar138._8_2_ = uVar164;
  auVar138._0_8_ = uVar14;
  uVar164 = (undefined2)(uVar14 >> 0x10);
  auVar85._4_8_ = auVar138._8_8_;
  auVar85._2_2_ = uVar164;
  auVar85._0_2_ = uVar164;
  fVar202 = (float)(auVar85._0_4_ >> 0x10);
  fVar253 = (float)(auVar138._8_4_ >> 0x10);
  uVar15 = *(ulong *)(prim + uVar107 * 0x18 + 6);
  uVar164 = (undefined2)(uVar15 >> 0x30);
  auVar173._8_4_ = 0;
  auVar173._0_8_ = uVar15;
  auVar173._12_2_ = uVar164;
  auVar173._14_2_ = uVar164;
  uVar164 = (undefined2)(uVar15 >> 0x20);
  auVar172._12_4_ = auVar173._12_4_;
  auVar172._8_2_ = 0;
  auVar172._0_8_ = uVar15;
  auVar172._10_2_ = uVar164;
  auVar171._10_6_ = auVar172._10_6_;
  auVar171._8_2_ = uVar164;
  auVar171._0_8_ = uVar15;
  uVar164 = (undefined2)(uVar15 >> 0x10);
  auVar86._4_8_ = auVar171._8_8_;
  auVar86._2_2_ = uVar164;
  auVar86._0_2_ = uVar164;
  uVar16 = *(ulong *)(prim + uVar107 * 0x1d + 6);
  uVar164 = (undefined2)(uVar16 >> 0x30);
  auVar143._8_4_ = 0;
  auVar143._0_8_ = uVar16;
  auVar143._12_2_ = uVar164;
  auVar143._14_2_ = uVar164;
  uVar164 = (undefined2)(uVar16 >> 0x20);
  auVar142._12_4_ = auVar143._12_4_;
  auVar142._8_2_ = 0;
  auVar142._0_8_ = uVar16;
  auVar142._10_2_ = uVar164;
  auVar141._10_6_ = auVar142._10_6_;
  auVar141._8_2_ = uVar164;
  auVar141._0_8_ = uVar16;
  uVar164 = (undefined2)(uVar16 >> 0x10);
  auVar87._4_8_ = auVar141._8_8_;
  auVar87._2_2_ = uVar164;
  auVar87._0_2_ = uVar164;
  fVar207 = (float)(auVar87._0_4_ >> 0x10);
  fVar254 = (float)(auVar141._8_4_ >> 0x10);
  uVar17 = *(ulong *)(prim + uVar107 * 0x21 + 6);
  uVar164 = (undefined2)(uVar17 >> 0x30);
  auVar176._8_4_ = 0;
  auVar176._0_8_ = uVar17;
  auVar176._12_2_ = uVar164;
  auVar176._14_2_ = uVar164;
  uVar164 = (undefined2)(uVar17 >> 0x20);
  auVar175._12_4_ = auVar176._12_4_;
  auVar175._8_2_ = 0;
  auVar175._0_8_ = uVar17;
  auVar175._10_2_ = uVar164;
  auVar174._10_6_ = auVar175._10_6_;
  auVar174._8_2_ = uVar164;
  auVar174._0_8_ = uVar17;
  uVar164 = (undefined2)(uVar17 >> 0x10);
  auVar88._4_8_ = auVar174._8_8_;
  auVar88._2_2_ = uVar164;
  auVar88._0_2_ = uVar164;
  uVar18 = *(ulong *)(prim + uVar107 * 0x1f + 6);
  uVar164 = (undefined2)(uVar18 >> 0x30);
  auVar146._8_4_ = 0;
  auVar146._0_8_ = uVar18;
  auVar146._12_2_ = uVar164;
  auVar146._14_2_ = uVar164;
  uVar164 = (undefined2)(uVar18 >> 0x20);
  auVar145._12_4_ = auVar146._12_4_;
  auVar145._8_2_ = 0;
  auVar145._0_8_ = uVar18;
  auVar145._10_2_ = uVar164;
  auVar144._10_6_ = auVar145._10_6_;
  auVar144._8_2_ = uVar164;
  auVar144._0_8_ = uVar18;
  uVar164 = (undefined2)(uVar18 >> 0x10);
  auVar89._4_8_ = auVar144._8_8_;
  auVar89._2_2_ = uVar164;
  auVar89._0_2_ = uVar164;
  fVar238 = (float)(auVar89._0_4_ >> 0x10);
  fVar256 = (float)(auVar144._8_4_ >> 0x10);
  uVar19 = *(ulong *)(prim + uVar107 * 0x23 + 6);
  uVar164 = (undefined2)(uVar19 >> 0x30);
  auVar179._8_4_ = 0;
  auVar179._0_8_ = uVar19;
  auVar179._12_2_ = uVar164;
  auVar179._14_2_ = uVar164;
  uVar164 = (undefined2)(uVar19 >> 0x20);
  auVar178._12_4_ = auVar179._12_4_;
  auVar178._8_2_ = 0;
  auVar178._0_8_ = uVar19;
  auVar178._10_2_ = uVar164;
  auVar177._10_6_ = auVar178._10_6_;
  auVar177._8_2_ = uVar164;
  auVar177._0_8_ = uVar19;
  uVar164 = (undefined2)(uVar19 >> 0x10);
  auVar90._4_8_ = auVar177._8_8_;
  auVar90._2_2_ = uVar164;
  auVar90._0_2_ = uVar164;
  uVar8 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar267._0_8_ =
       CONCAT44(((((float)(auVar263._4_4_ >> 0x10) - fVar166) * fVar206 + fVar166) - fVar387) *
                fVar348,((((float)(int)(short)uVar10 - auVar130._0_4_) * fVar206 + auVar130._0_4_) -
                        fVar406) * fVar395);
  auVar267._8_4_ =
       ((((float)(auVar264._8_4_ >> 0x10) - auVar122._8_4_) * fVar206 + auVar122._8_4_) - fVar257) *
       fVar349;
  auVar267._12_4_ =
       ((((float)(auVar265._12_4_ >> 0x10) - (float)(auVar128._12_4_ >> 0x10)) * fVar206 +
        (float)(auVar128._12_4_ >> 0x10)) - fVar259) * fVar362;
  auVar318._0_4_ =
       ((((float)(int)(short)uVar12 - auVar134._0_4_) * fVar206 + auVar134._0_4_) - fVar406) *
       fVar395;
  auVar318._4_4_ =
       ((((float)(auVar314._4_4_ >> 0x10) - fVar167) * fVar206 + fVar167) - fVar387) * fVar348;
  auVar318._8_4_ =
       ((((float)(auVar315._8_4_ >> 0x10) - auVar123._8_4_) * fVar206 + auVar123._8_4_) - fVar257) *
       fVar349;
  auVar318._12_4_ =
       ((((float)(auVar316._12_4_ >> 0x10) - (float)(auVar132._12_4_ >> 0x10)) * fVar206 +
        (float)(auVar132._12_4_ >> 0x10)) - fVar259) * fVar362;
  auVar354._0_8_ =
       CONCAT44(((((float)(auVar84._0_4_ >> 0x10) - fVar200) * fVar206 + fVar200) - fVar326) *
                fVar121,((((float)(int)(short)uVar13 - (float)(int)(short)uVar108) * fVar206 +
                         (float)(int)(short)uVar108) - fVar303) * fVar410);
  auVar354._8_4_ =
       ((((float)(auVar168._8_4_ >> 0x10) - fVar244) * fVar206 + fVar244) - fVar337) * fVar240;
  auVar354._12_4_ =
       ((((float)(auVar169._12_4_ >> 0x10) - (float)(auVar136._12_4_ >> 0x10)) * fVar206 +
        (float)(auVar136._12_4_ >> 0x10)) - fVar347) * fVar296;
  auVar369._0_4_ =
       ((((float)(int)(short)uVar15 - (float)(int)(short)uVar14) * fVar206 +
        (float)(int)(short)uVar14) - fVar303) * fVar410;
  auVar369._4_4_ =
       ((((float)(auVar86._0_4_ >> 0x10) - fVar202) * fVar206 + fVar202) - fVar326) * fVar121;
  auVar369._8_4_ =
       ((((float)(auVar171._8_4_ >> 0x10) - fVar253) * fVar206 + fVar253) - fVar337) * fVar240;
  auVar369._12_4_ =
       ((((float)(auVar172._12_4_ >> 0x10) - (float)(auVar139._12_4_ >> 0x10)) * fVar206 +
        (float)(auVar139._12_4_ >> 0x10)) - fVar347) * fVar296;
  auVar382._0_8_ =
       CONCAT44(((((float)(auVar88._0_4_ >> 0x10) - fVar207) * fVar206 + fVar207) - fVar425) *
                fVar165,((((float)(int)(short)uVar17 - (float)(int)(short)uVar16) * fVar206 +
                         (float)(int)(short)uVar16) - fVar417) * fVar364);
  auVar382._8_4_ =
       ((((float)(auVar174._8_4_ >> 0x10) - fVar254) * fVar206 + fVar254) - fVar426) * fVar243;
  auVar382._12_4_ =
       ((((float)(auVar175._12_4_ >> 0x10) - (float)(auVar142._12_4_ >> 0x10)) * fVar206 +
        (float)(auVar142._12_4_ >> 0x10)) - fVar436) * fVar394;
  auVar401._0_4_ =
       ((((float)(int)(short)uVar19 - (float)(int)(short)uVar18) * fVar206 +
        (float)(int)(short)uVar18) - fVar417) * fVar364;
  auVar401._4_4_ =
       ((((float)(auVar90._0_4_ >> 0x10) - fVar238) * fVar206 + fVar238) - fVar425) * fVar165;
  auVar401._8_4_ =
       ((((float)(auVar177._8_4_ >> 0x10) - fVar256) * fVar206 + fVar256) - fVar426) * fVar243;
  auVar401._12_4_ =
       ((((float)(auVar178._12_4_ >> 0x10) - (float)(auVar145._12_4_ >> 0x10)) * fVar206 +
        (float)(auVar145._12_4_ >> 0x10)) - fVar436) * fVar394;
  auVar226._8_4_ = auVar267._8_4_;
  auVar226._0_8_ = auVar267._0_8_;
  auVar226._12_4_ = auVar267._12_4_;
  auVar262 = minps(auVar226,auVar318);
  auVar147._8_4_ = auVar354._8_4_;
  auVar147._0_8_ = auVar354._0_8_;
  auVar147._12_4_ = auVar354._12_4_;
  auVar125 = minps(auVar147,auVar369);
  auVar262 = maxps(auVar262,auVar125);
  auVar148._8_4_ = auVar382._8_4_;
  auVar148._0_8_ = auVar382._0_8_;
  auVar148._12_4_ = auVar382._12_4_;
  auVar125 = minps(auVar148,auVar401);
  auVar180._4_4_ = uVar8;
  auVar180._0_4_ = uVar8;
  auVar180._8_4_ = uVar8;
  auVar180._12_4_ = uVar8;
  auVar125 = maxps(auVar125,auVar180);
  auVar125 = maxps(auVar262,auVar125);
  fVar410 = auVar125._0_4_ * 0.99999964;
  fVar121 = auVar125._4_4_ * 0.99999964;
  fVar165 = auVar125._8_4_ * 0.99999964;
  fVar166 = auVar125._12_4_ * 0.99999964;
  auVar125 = maxps(auVar267,auVar318);
  auVar262 = maxps(auVar354,auVar369);
  auVar125 = minps(auVar125,auVar262);
  auVar262 = maxps(auVar382,auVar401);
  uVar8 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar149._4_4_ = uVar8;
  auVar149._0_4_ = uVar8;
  auVar149._8_4_ = uVar8;
  auVar149._12_4_ = uVar8;
  auVar262 = minps(auVar262,auVar149);
  auVar125 = minps(auVar125,auVar262);
  auVar181._0_4_ = -(uint)(PVar20 != (Primitive)0x0 && fVar410 <= auVar125._0_4_ * 1.0000004);
  auVar181._4_4_ = -(uint)(1 < (byte)PVar20 && fVar121 <= auVar125._4_4_ * 1.0000004);
  auVar181._8_4_ = -(uint)(2 < (byte)PVar20 && fVar165 <= auVar125._8_4_ * 1.0000004);
  auVar181._12_4_ = -(uint)(3 < (byte)PVar20 && fVar166 <= auVar125._12_4_ * 1.0000004);
  uVar116 = movmskps((int)(uVar107 * 0x23),auVar181);
  local_398 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  bVar35 = (int)mm_lookupmask_ps._240_4_ < 0;
  bVar36 = (int)mm_lookupmask_ps._244_4_ < 0;
  bVar37 = (int)mm_lookupmask_ps._248_4_ < 0;
  local_4f8 = ray;
  local_390 = prim;
LAB_00393643:
  if (uVar116 == 0) {
LAB_00395cc3:
    return uVar116 != 0;
  }
  lVar112 = 0;
  if (uVar116 != 0) {
    for (; (uVar116 >> lVar112 & 1) == 0; lVar112 = lVar112 + 1) {
    }
  }
  uVar117 = *(uint *)(local_390 + 2);
  uVar118 = *(uint *)(local_390 + lVar112 * 4 + 6);
  pGVar28 = (context->scene->geometries).items[uVar117].ptr;
  fVar167 = pGVar28->fnumTimeSegments;
  fVar200 = (pGVar28->time_range).lower;
  fVar202 = ((*(float *)(local_4f8 + k * 4 + 0x70) - fVar200) /
            ((pGVar28->time_range).upper - fVar200)) * fVar167;
  fVar200 = floorf(fVar202);
  fVar167 = fVar167 + -1.0;
  if (fVar167 <= fVar200) {
    fVar200 = fVar167;
  }
  fVar167 = 0.0;
  if (0.0 <= fVar200) {
    fVar167 = fVar200;
  }
  uVar108 = (ulong)*(uint *)(*(long *)&pGVar28->field_0x58 +
                            (ulong)uVar118 *
                            pGVar28[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                            _M_i);
  _Var29 = pGVar28[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar115 = (long)(int)fVar167 * 0x38;
  lVar30 = *(long *)(_Var29 + lVar115);
  lVar31 = *(long *)(_Var29 + 0x10 + lVar115);
  pfVar3 = (float *)(lVar30 + lVar31 * uVar108);
  fVar200 = *pfVar3;
  fVar207 = pfVar3[1];
  fVar238 = pfVar3[2];
  fVar240 = pfVar3[3];
  lVar112 = uVar108 + 1;
  pfVar3 = (float *)(lVar30 + lVar31 * lVar112);
  fVar243 = *pfVar3;
  fVar244 = pfVar3[1];
  fVar253 = pfVar3[2];
  fVar254 = pfVar3[3];
  lVar1 = uVar108 + 2;
  pfVar3 = (float *)(lVar30 + lVar31 * lVar1);
  fVar256 = *pfVar3;
  fVar296 = pfVar3[1];
  fVar394 = pfVar3[2];
  fVar206 = pfVar3[3];
  lVar2 = uVar108 + 3;
  pfVar3 = (float *)(lVar30 + lVar31 * lVar2);
  fVar303 = *pfVar3;
  fVar326 = pfVar3[1];
  fVar337 = pfVar3[2];
  fVar347 = pfVar3[3];
  lVar30 = *(long *)&pGVar28[4].fnumTimeSegments;
  lVar31 = *(long *)(lVar30 + lVar115);
  lVar32 = *(long *)(lVar30 + 0x10 + lVar115);
  pfVar3 = (float *)(lVar31 + lVar32 * uVar108);
  fVar406 = *pfVar3;
  fVar387 = pfVar3[1];
  fVar257 = pfVar3[2];
  pfVar4 = (float *)(lVar31 + lVar32 * lVar112);
  fVar259 = *pfVar4;
  fVar348 = pfVar4[1];
  fVar349 = pfVar4[2];
  pfVar5 = (float *)(lVar31 + lVar32 * lVar1);
  fVar362 = *pfVar5;
  fVar364 = pfVar5[1];
  fVar395 = pfVar5[2];
  fVar202 = fVar202 - fVar167;
  pfVar6 = (float *)(lVar31 + lVar32 * lVar2);
  fVar167 = *pfVar6;
  fVar407 = pfVar6[1];
  fVar411 = pfVar6[2];
  fVar414 = fVar200 * 0.16666667 + fVar243 * 0.6666667 + fVar256 * 0.16666667 + fVar303 * 0.0;
  fVar425 = fVar207 * 0.16666667 + fVar244 * 0.6666667 + fVar296 * 0.16666667 + fVar326 * 0.0;
  fVar436 = fVar238 * 0.16666667 + fVar253 * 0.6666667 + fVar394 * 0.16666667 + fVar337 * 0.0;
  fVar446 = fVar240 * 0.16666667 + fVar254 * 0.6666667 + fVar206 * 0.16666667 + fVar347 * 0.0;
  fVar245 = ((fVar256 * 0.5 + fVar303 * 0.0) - fVar243 * 0.0) - fVar200 * 0.5;
  fVar255 = ((fVar296 * 0.5 + fVar326 * 0.0) - fVar244 * 0.0) - fVar207 * 0.5;
  fVar258 = ((fVar394 * 0.5 + fVar337 * 0.0) - fVar253 * 0.0) - fVar238 * 0.5;
  fVar260 = ((fVar206 * 0.5 + fVar347 * 0.0) - fVar254 * 0.0) - fVar240 * 0.5;
  fVar396 = fVar406 * 0.16666667 + fVar259 * 0.6666667 + fVar362 * 0.16666667 + fVar167 * 0.0;
  fVar408 = fVar387 * 0.16666667 + fVar348 * 0.6666667 + fVar364 * 0.16666667 + fVar407 * 0.0;
  fVar412 = fVar257 * 0.16666667 + fVar349 * 0.6666667 + fVar395 * 0.16666667 + fVar411 * 0.0;
  fVar415 = pfVar3[3] * 0.16666667 +
            pfVar4[3] * 0.6666667 + pfVar5[3] * 0.16666667 + pfVar6[3] * 0.0;
  fVar417 = ((fVar362 * 0.5 + fVar167 * 0.0) - fVar259 * 0.0) - fVar406 * 0.5;
  fVar426 = ((fVar364 * 0.5 + fVar407 * 0.0) - fVar348 * 0.0) - fVar387 * 0.5;
  fVar438 = ((fVar395 * 0.5 + fVar411 * 0.0) - fVar349 * 0.0) - fVar257 * 0.5;
  fVar261 = fVar243 * 0.16666667 + fVar256 * 0.6666667 + fVar303 * 0.16666667 + fVar200 * 0.0;
  fVar278 = fVar244 * 0.16666667 + fVar296 * 0.6666667 + fVar326 * 0.16666667 + fVar207 * 0.0;
  fVar279 = fVar253 * 0.16666667 + fVar394 * 0.6666667 + fVar337 * 0.16666667 + fVar238 * 0.0;
  fVar281 = fVar254 * 0.16666667 + fVar206 * 0.6666667 + fVar347 * 0.16666667 + fVar240 * 0.0;
  fVar449 = ((fVar256 * 0.0 + fVar303 * 0.5) - fVar243 * 0.5) - fVar200 * 0.0;
  fVar452 = ((fVar296 * 0.0 + fVar326 * 0.5) - fVar244 * 0.5) - fVar207 * 0.0;
  fVar203 = ((fVar394 * 0.0 + fVar337 * 0.5) - fVar253 * 0.5) - fVar238 * 0.0;
  fVar347 = ((fVar206 * 0.0 + fVar347 * 0.5) - fVar254 * 0.5) - fVar240 * 0.0;
  fVar238 = fVar259 * 0.16666667 + fVar362 * 0.6666667 + fVar167 * 0.16666667 + fVar406 * 0.0;
  fVar240 = fVar348 * 0.16666667 + fVar364 * 0.6666667 + fVar407 * 0.16666667 + fVar387 * 0.0;
  fVar243 = fVar349 * 0.16666667 + fVar395 * 0.6666667 + fVar411 * 0.16666667 + fVar257 * 0.0;
  fVar167 = ((fVar362 * 0.0 + fVar167 * 0.5) - fVar259 * 0.5) - fVar406 * 0.0;
  fVar200 = ((fVar364 * 0.0 + fVar407 * 0.5) - fVar348 * 0.5) - fVar387 * 0.0;
  fVar207 = ((fVar395 * 0.0 + fVar411 * 0.5) - fVar349 * 0.5) - fVar257 * 0.0;
  fVar418 = fVar255 * fVar396 - fVar408 * fVar245;
  fVar408 = fVar258 * fVar408 - fVar412 * fVar255;
  fVar427 = fVar245 * fVar412 - fVar396 * fVar258;
  fVar387 = fVar255 * fVar417 - fVar426 * fVar245;
  fVar259 = fVar258 * fVar426 - fVar438 * fVar255;
  fVar348 = fVar245 * fVar438 - fVar417 * fVar258;
  fVar395 = fVar452 * fVar238 - fVar240 * fVar449;
  fVar407 = fVar203 * fVar240 - fVar243 * fVar452;
  fVar411 = fVar449 * fVar243 - fVar238 * fVar203;
  fVar349 = fVar452 * fVar167 - fVar200 * fVar449;
  fVar362 = fVar203 * fVar200 - fVar207 * fVar452;
  fVar364 = fVar449 * fVar207 - fVar167 * fVar203;
  fVar406 = fVar427 * fVar427 + fVar408 * fVar408 + fVar418 * fVar418;
  auVar125 = ZEXT416((uint)fVar406);
  auVar262 = rsqrtss(ZEXT416((uint)fVar406),auVar125);
  fVar167 = auVar262._0_4_;
  fVar367 = fVar167 * 1.5 - fVar167 * fVar167 * fVar406 * 0.5 * fVar167;
  fVar396 = fVar418 * fVar387 + fVar427 * fVar348 + fVar408 * fVar259;
  auVar125 = rcpss(auVar125,auVar125);
  fVar257 = (2.0 - fVar406 * auVar125._0_4_) * auVar125._0_4_;
  fVar397 = fVar411 * fVar411 + fVar407 * fVar407 + fVar395 * fVar395;
  auVar262 = ZEXT416((uint)fVar397);
  auVar125 = rsqrtss(ZEXT416((uint)fVar397),auVar262);
  fVar167 = auVar125._0_4_;
  fVar412 = fVar167 * 1.5 - fVar167 * fVar167 * fVar397 * 0.5 * fVar167;
  fVar428 = fVar395 * fVar349 + fVar411 * fVar364 + fVar407 * fVar362;
  lVar31 = *(long *)(_Var29 + 0x38 + lVar115);
  lVar32 = *(long *)(_Var29 + 0x48 + lVar115);
  pfVar3 = (float *)(lVar31 + lVar32 * uVar108);
  fVar167 = *pfVar3;
  fVar200 = pfVar3[1];
  fVar207 = pfVar3[2];
  fVar238 = pfVar3[3];
  pfVar3 = (float *)(lVar31 + lVar32 * lVar112);
  fVar240 = *pfVar3;
  fVar243 = pfVar3[1];
  fVar244 = pfVar3[2];
  fVar253 = pfVar3[3];
  pfVar3 = (float *)(lVar31 + lVar32 * lVar1);
  fVar254 = *pfVar3;
  fVar256 = pfVar3[1];
  fVar296 = pfVar3[2];
  fVar394 = pfVar3[3];
  auVar125 = rcpss(auVar262,auVar262);
  pfVar3 = (float *)(lVar31 + lVar32 * lVar2);
  fVar206 = *pfVar3;
  fVar303 = pfVar3[1];
  fVar326 = pfVar3[2];
  fVar337 = pfVar3[3];
  lVar31 = *(long *)(lVar30 + 0x38 + lVar115);
  lVar30 = *(long *)(lVar30 + 0x48 + lVar115);
  uVar108 = uVar108 * lVar30;
  fVar429 = (2.0 - fVar397 * auVar125._0_4_) * auVar125._0_4_;
  fVar417 = fVar446 * fVar408 * fVar367;
  fVar426 = fVar446 * fVar427 * fVar367;
  fVar438 = fVar446 * fVar418 * fVar367;
  fVar300 = fVar414 - fVar417;
  fVar304 = fVar425 - fVar426;
  fVar306 = fVar436 - fVar438;
  fVar380 = fVar446 * fVar257 * (fVar406 * fVar259 - fVar396 * fVar408) * fVar367 +
            fVar260 * fVar408 * fVar367;
  fVar388 = fVar446 * fVar257 * (fVar406 * fVar348 - fVar396 * fVar427) * fVar367 +
            fVar260 * fVar427 * fVar367;
  fVar390 = fVar446 * fVar257 * (fVar406 * fVar387 - fVar396 * fVar418) * fVar367 +
            fVar260 * fVar418 * fVar367;
  fVar417 = fVar417 + fVar414;
  fVar426 = fVar426 + fVar425;
  fVar438 = fVar438 + fVar436;
  fVar414 = fVar281 * fVar407 * fVar412;
  fVar425 = fVar281 * fVar411 * fVar412;
  fVar436 = fVar281 * fVar395 * fVar412;
  fVar309 = fVar261 - fVar414;
  fVar327 = fVar278 - fVar425;
  fVar331 = fVar279 - fVar436;
  fVar396 = fVar281 * fVar429 * (fVar397 * fVar362 - fVar428 * fVar407) * fVar412 +
            fVar347 * fVar407 * fVar412;
  fVar408 = fVar281 * fVar429 * (fVar397 * fVar364 - fVar428 * fVar411) * fVar412 +
            fVar347 * fVar411 * fVar412;
  fVar281 = fVar281 * fVar429 * (fVar397 * fVar349 - fVar428 * fVar395) * fVar412 +
            fVar347 * fVar395 * fVar412;
  fVar414 = fVar414 + fVar261;
  fVar425 = fVar425 + fVar278;
  fVar436 = fVar436 + fVar279;
  fVar310 = fVar167 * 0.16666667 + fVar240 * 0.6666667 + fVar254 * 0.16666667 + fVar206 * 0.0;
  fVar328 = fVar200 * 0.16666667 + fVar243 * 0.6666667 + fVar256 * 0.16666667 + fVar303 * 0.0;
  fVar332 = fVar207 * 0.16666667 + fVar244 * 0.6666667 + fVar296 * 0.16666667 + fVar326 * 0.0;
  fVar335 = fVar238 * 0.16666667 + fVar253 * 0.6666667 + fVar394 * 0.16666667 + fVar337 * 0.0;
  fVar261 = ((fVar254 * 0.5 + fVar206 * 0.0) - fVar240 * 0.0) - fVar167 * 0.5;
  fVar278 = ((fVar256 * 0.5 + fVar303 * 0.0) - fVar243 * 0.0) - fVar200 * 0.5;
  fVar279 = ((fVar296 * 0.5 + fVar326 * 0.0) - fVar244 * 0.0) - fVar207 * 0.5;
  fVar412 = ((fVar394 * 0.5 + fVar337 * 0.0) - fVar253 * 0.0) - fVar238 * 0.5;
  pfVar3 = (float *)(lVar31 + lVar30 * lVar2);
  fVar347 = *pfVar3;
  fVar406 = pfVar3[1];
  fVar387 = pfVar3[2];
  pfVar4 = (float *)(lVar31 + lVar1 * lVar30);
  fVar257 = *pfVar4;
  fVar259 = pfVar4[1];
  fVar348 = pfVar4[2];
  pfVar5 = (float *)(lVar31 + lVar112 * lVar30);
  fVar349 = *pfVar5;
  fVar362 = pfVar5[1];
  fVar364 = pfVar5[2];
  pfVar6 = (float *)(lVar31 + uVar108);
  fVar395 = *pfVar6;
  fVar407 = pfVar6[1];
  fVar411 = pfVar6[2];
  fVar311 = fVar395 * 0.16666667 + fVar349 * 0.6666667 + fVar257 * 0.16666667 + fVar347 * 0.0;
  fVar329 = fVar407 * 0.16666667 + fVar362 * 0.6666667 + fVar259 * 0.16666667 + fVar406 * 0.0;
  fVar333 = fVar411 * 0.16666667 + fVar364 * 0.6666667 + fVar348 * 0.16666667 + fVar387 * 0.0;
  fVar336 = pfVar6[3] * 0.16666667 +
            pfVar5[3] * 0.6666667 + pfVar4[3] * 0.16666667 + pfVar3[3] * 0.0;
  fVar429 = ((fVar257 * 0.5 + fVar347 * 0.0) - fVar349 * 0.0) - fVar395 * 0.5;
  fVar294 = ((fVar259 * 0.5 + fVar406 * 0.0) - fVar362 * 0.0) - fVar407 * 0.5;
  fVar297 = ((fVar348 * 0.5 + fVar387 * 0.0) - fVar364 * 0.0) - fVar411 * 0.5;
  fVar397 = fVar240 * 0.16666667 + fVar254 * 0.6666667 + fVar206 * 0.16666667 + fVar167 * 0.0;
  fVar418 = fVar243 * 0.16666667 + fVar256 * 0.6666667 + fVar303 * 0.16666667 + fVar200 * 0.0;
  fVar427 = fVar244 * 0.16666667 + fVar296 * 0.6666667 + fVar326 * 0.16666667 + fVar207 * 0.0;
  fVar428 = fVar253 * 0.16666667 + fVar394 * 0.6666667 + fVar337 * 0.16666667 + fVar238 * 0.0;
  fVar240 = ((fVar254 * 0.0 + fVar206 * 0.5) - fVar240 * 0.5) - fVar167 * 0.0;
  fVar243 = ((fVar256 * 0.0 + fVar303 * 0.5) - fVar243 * 0.5) - fVar200 * 0.0;
  fVar244 = ((fVar296 * 0.0 + fVar326 * 0.5) - fVar244 * 0.5) - fVar207 * 0.0;
  fVar238 = ((fVar394 * 0.0 + fVar337 * 0.5) - fVar253 * 0.5) - fVar238 * 0.0;
  fVar253 = fVar349 * 0.16666667 + fVar257 * 0.6666667 + fVar347 * 0.16666667 + fVar395 * 0.0;
  fVar254 = fVar362 * 0.16666667 + fVar259 * 0.6666667 + fVar406 * 0.16666667 + fVar407 * 0.0;
  fVar394 = fVar364 * 0.16666667 + fVar348 * 0.6666667 + fVar387 * 0.16666667 + fVar411 * 0.0;
  fVar167 = ((fVar257 * 0.0 + fVar347 * 0.5) - fVar349 * 0.5) - fVar395 * 0.0;
  fVar200 = ((fVar259 * 0.0 + fVar406 * 0.5) - fVar362 * 0.5) - fVar407 * 0.0;
  fVar207 = ((fVar348 * 0.0 + fVar387 * 0.5) - fVar364 * 0.5) - fVar411 * 0.0;
  fVar337 = fVar278 * fVar311 - fVar329 * fVar261;
  fVar257 = fVar279 * fVar329 - fVar333 * fVar278;
  fVar348 = fVar261 * fVar333 - fVar311 * fVar279;
  fVar303 = fVar278 * fVar429 - fVar294 * fVar261;
  fVar256 = fVar279 * fVar294 - fVar297 * fVar278;
  fVar296 = fVar261 * fVar297 - fVar429 * fVar279;
  fVar206 = fVar243 * fVar253 - fVar254 * fVar240;
  fVar326 = fVar244 * fVar254 - fVar394 * fVar243;
  fVar259 = fVar240 * fVar394 - fVar253 * fVar244;
  fVar253 = fVar243 * fVar167 - fVar200 * fVar240;
  fVar254 = fVar244 * fVar200 - fVar207 * fVar243;
  fVar394 = fVar240 * fVar207 - fVar167 * fVar244;
  fVar167 = fVar348 * fVar348 + fVar257 * fVar257 + fVar337 * fVar337;
  auVar125 = ZEXT416((uint)fVar167);
  auVar262 = rsqrtss(ZEXT416((uint)fVar167),auVar125);
  fVar200 = auVar262._0_4_;
  fVar429 = fVar200 * 1.5 - fVar200 * fVar200 * fVar167 * 0.5 * fVar200;
  fVar207 = fVar337 * fVar303 + fVar348 * fVar296 + fVar257 * fVar256;
  auVar125 = rcpss(auVar125,auVar125);
  fVar200 = (2.0 - fVar167 * auVar125._0_4_) * auVar125._0_4_;
  fVar362 = fVar259 * fVar259 + fVar326 * fVar326 + fVar206 * fVar206;
  auVar125 = ZEXT416((uint)fVar362);
  auVar262 = rsqrtss(ZEXT416((uint)fVar362),auVar125);
  fVar347 = auVar262._0_4_;
  fVar364 = fVar347 * 1.5 - fVar347 * fVar347 * fVar362 * 0.5 * fVar347;
  fVar395 = fVar206 * fVar253 + fVar259 * fVar394 + fVar326 * fVar254;
  auVar125 = rcpss(auVar125,auVar125);
  fVar407 = (2.0 - fVar362 * auVar125._0_4_) * auVar125._0_4_;
  fVar347 = fVar335 * fVar257 * fVar429;
  fVar406 = fVar335 * fVar348 * fVar429;
  fVar387 = fVar335 * fVar337 * fVar429;
  fVar256 = fVar335 * fVar200 * (fVar167 * fVar256 - fVar207 * fVar257) * fVar429 +
            fVar412 * fVar257 * fVar429;
  fVar296 = fVar335 * fVar200 * (fVar167 * fVar296 - fVar207 * fVar348) * fVar429 +
            fVar412 * fVar348 * fVar429;
  fVar337 = fVar335 * fVar200 * (fVar167 * fVar303 - fVar207 * fVar337) * fVar429 +
            fVar412 * fVar337 * fVar429;
  fVar303 = fVar310 - fVar347;
  fVar257 = fVar328 - fVar406;
  fVar348 = fVar332 - fVar387;
  fVar347 = fVar347 + fVar310;
  fVar406 = fVar406 + fVar328;
  fVar387 = fVar387 + fVar332;
  fVar167 = fVar428 * fVar326 * fVar364;
  fVar200 = fVar428 * fVar259 * fVar364;
  fVar207 = fVar428 * fVar206 * fVar364;
  fVar349 = fVar428 * fVar407 * (fVar362 * fVar254 - fVar395 * fVar326) * fVar364 +
            fVar238 * fVar326 * fVar364;
  fVar394 = fVar428 * fVar407 * (fVar362 * fVar394 - fVar395 * fVar259) * fVar364 +
            fVar238 * fVar259 * fVar364;
  fVar259 = fVar428 * fVar407 * (fVar362 * fVar253 - fVar395 * fVar206) * fVar364 +
            fVar238 * fVar206 * fVar364;
  fVar238 = fVar397 - fVar167;
  fVar253 = fVar418 - fVar200;
  fVar254 = fVar427 - fVar207;
  fVar167 = fVar167 + fVar397;
  fVar200 = fVar200 + fVar418;
  fVar207 = fVar207 + fVar427;
  fVar428 = 1.0 - fVar202;
  fVar294 = fVar300 * fVar428 + fVar303 * fVar202;
  fVar297 = fVar304 * fVar428 + fVar257 * fVar202;
  fVar310 = fVar306 * fVar428 + fVar348 * fVar202;
  fVar311 = ((fVar245 - fVar380) * 0.33333334 + fVar300) * fVar428 +
            ((fVar261 - fVar256) * 0.33333334 + fVar303) * fVar202;
  fVar328 = ((fVar255 - fVar388) * 0.33333334 + fVar304) * fVar428 +
            ((fVar278 - fVar296) * 0.33333334 + fVar257) * fVar202;
  fVar332 = ((fVar258 - fVar390) * 0.33333334 + fVar306) * fVar428 +
            ((fVar279 - fVar337) * 0.33333334 + fVar348) * fVar202;
  fVar397 = (fVar309 - (fVar449 - fVar396) * 0.33333334) * fVar428 +
            (fVar238 - (fVar240 - fVar349) * 0.33333334) * fVar202;
  fVar418 = (fVar327 - (fVar452 - fVar408) * 0.33333334) * fVar428 +
            (fVar253 - (fVar243 - fVar394) * 0.33333334) * fVar202;
  fVar427 = (fVar331 - (fVar203 - fVar281) * 0.33333334) * fVar428 +
            (fVar254 - (fVar244 - fVar259) * 0.33333334) * fVar202;
  fVar206 = fVar309 * fVar428 + fVar238 * fVar202;
  fVar303 = fVar327 * fVar428 + fVar253 * fVar202;
  fVar326 = fVar331 * fVar428 + fVar254 * fVar202;
  fVar439 = fVar417 * fVar428 + fVar347 * fVar202;
  fVar447 = fVar426 * fVar428 + fVar406 * fVar202;
  fVar450 = fVar438 * fVar428 + fVar387 * fVar202;
  fVar245 = ((fVar380 + fVar245) * 0.33333334 + fVar417) * fVar428 +
            ((fVar256 + fVar261) * 0.33333334 + fVar347) * fVar202;
  fVar261 = ((fVar388 + fVar255) * 0.33333334 + fVar426) * fVar428 +
            ((fVar296 + fVar278) * 0.33333334 + fVar406) * fVar202;
  fVar438 = ((fVar390 + fVar258) * 0.33333334 + fVar438) * fVar428 +
            ((fVar337 + fVar279) * 0.33333334 + fVar387) * fVar202;
  fVar256 = (fVar414 - (fVar396 + fVar449) * 0.33333334) * fVar428 +
            (fVar167 - (fVar349 + fVar240) * 0.33333334) * fVar202;
  fVar296 = (fVar425 - (fVar408 + fVar452) * 0.33333334) * fVar428 +
            (fVar200 - (fVar394 + fVar243) * 0.33333334) * fVar202;
  fVar394 = (fVar436 - (fVar281 + fVar203) * 0.33333334) * fVar428 +
            (fVar207 - (fVar259 + fVar244) * 0.33333334) * fVar202;
  fVar449 = fVar428 * fVar414 + fVar202 * fVar167;
  fVar452 = fVar428 * fVar425 + fVar202 * fVar200;
  fVar203 = fVar428 * fVar436 + fVar202 * fVar207;
  fVar167 = *(float *)(local_4f8 + k * 4);
  fVar200 = *(float *)(local_4f8 + k * 4 + 0x10);
  fVar207 = *(float *)(local_4f8 + k * 4 + 0x20);
  fVar337 = fVar294 - fVar167;
  fVar347 = fVar297 - fVar200;
  fVar406 = fVar310 - fVar207;
  fVar238 = pre->ray_space[k].vx.field_0.m128[0];
  fVar240 = pre->ray_space[k].vx.field_0.m128[1];
  fVar243 = pre->ray_space[k].vy.field_0.m128[0];
  fVar244 = pre->ray_space[k].vy.field_0.m128[1];
  fVar253 = pre->ray_space[k].vz.field_0.m128[0];
  fVar254 = pre->ray_space[k].vz.field_0.m128[1];
  fVar396 = fVar337 * fVar238 + fVar347 * fVar243 + fVar406 * fVar253;
  fVar255 = fVar337 * fVar240 + fVar347 * fVar244 + fVar406 * fVar254;
  auVar150._4_4_ = fVar255;
  auVar150._0_4_ = fVar396;
  fVar387 = fVar311 - fVar167;
  fVar362 = fVar328 - fVar200;
  fVar414 = fVar332 - fVar207;
  fVar426 = fVar387 * fVar238 + fVar362 * fVar243 + fVar414 * fVar253;
  fVar436 = fVar387 * fVar240 + fVar362 * fVar244 + fVar414 * fVar254;
  auVar402._4_4_ = fVar436;
  auVar402._0_4_ = fVar426;
  fVar257 = fVar397 - fVar167;
  fVar364 = fVar418 - fVar200;
  fVar417 = fVar427 - fVar207;
  fVar259 = fVar257 * fVar238 + fVar364 * fVar243 + fVar417 * fVar253;
  fVar395 = fVar257 * fVar240 + fVar364 * fVar244 + fVar417 * fVar254;
  fVar348 = fVar206 - fVar167;
  fVar407 = fVar303 - fVar200;
  fVar425 = fVar326 - fVar207;
  fVar349 = fVar348 * fVar238 + fVar407 * fVar243 + fVar425 * fVar253;
  fVar411 = fVar348 * fVar240 + fVar407 * fVar244 + fVar425 * fVar254;
  auVar338._4_4_ = fVar411;
  auVar338._0_4_ = fVar349;
  fVar408 = fVar439 - fVar167;
  fVar281 = fVar447 - fVar200;
  fVar304 = fVar450 - fVar207;
  fVar380 = fVar408 * fVar238 + fVar281 * fVar243 + fVar304 * fVar253;
  fVar388 = fVar408 * fVar240 + fVar281 * fVar244 + fVar304 * fVar254;
  fVar278 = fVar245 - fVar167;
  fVar279 = fVar261 - fVar200;
  fVar306 = fVar438 - fVar207;
  fVar258 = fVar278 * fVar238 + fVar279 * fVar243 + fVar306 * fVar253;
  fVar300 = fVar278 * fVar240 + fVar279 * fVar244 + fVar306 * fVar254;
  auVar402._12_4_ = fVar300;
  auVar402._8_4_ = fVar258;
  fVar309 = fVar256 - fVar167;
  fVar329 = fVar296 - fVar200;
  fVar333 = fVar394 - fVar207;
  fVar327 = fVar309 * fVar238 + fVar329 * fVar243 + fVar333 * fVar253;
  fVar331 = fVar309 * fVar240 + fVar329 * fVar244 + fVar333 * fVar254;
  fVar167 = fVar449 - fVar167;
  fVar200 = fVar452 - fVar200;
  fVar207 = fVar203 - fVar207;
  fVar243 = fVar167 * fVar238 + fVar200 * fVar243 + fVar207 * fVar253;
  fVar240 = fVar167 * fVar240 + fVar200 * fVar244 + fVar207 * fVar254;
  auVar338._12_4_ = fVar240;
  auVar338._8_4_ = fVar243;
  auVar150._8_4_ = fVar380;
  auVar150._12_4_ = fVar388;
  auVar125 = minps(auVar150,auVar402);
  auVar182._8_4_ = fVar327;
  auVar182._0_8_ = CONCAT44(fVar395,fVar259);
  auVar182._12_4_ = fVar331;
  auVar262 = minps(auVar182,auVar338);
  auVar125 = minps(auVar125,auVar262);
  auVar183._4_4_ = fVar255;
  auVar183._0_4_ = fVar396;
  auVar183._8_4_ = fVar380;
  auVar183._12_4_ = fVar388;
  auVar262 = maxps(auVar183,auVar402);
  auVar227._8_4_ = fVar327;
  auVar227._0_8_ = CONCAT44(fVar395,fVar259);
  auVar227._12_4_ = fVar331;
  auVar124 = maxps(auVar227,auVar338);
  auVar184 = maxps(auVar262,auVar124);
  auVar38._4_8_ = auVar124._8_8_;
  auVar38._0_4_ = auVar125._4_4_;
  auVar228._0_8_ = auVar38._0_8_ << 0x20;
  auVar228._8_4_ = auVar125._8_4_;
  auVar228._12_4_ = auVar125._12_4_;
  auVar229._8_8_ = auVar125._8_8_;
  auVar229._0_8_ = auVar228._8_8_;
  auVar262 = minps(auVar125,auVar229);
  auVar39._4_8_ = auVar125._8_8_;
  auVar39._0_4_ = auVar184._4_4_;
  auVar230._0_8_ = auVar39._0_8_ << 0x20;
  auVar230._8_4_ = auVar184._8_4_;
  auVar230._12_4_ = auVar184._12_4_;
  auVar231._8_8_ = auVar184._8_8_;
  auVar231._0_8_ = auVar230._8_8_;
  auVar125 = maxps(auVar184,auVar231);
  auVar151._0_8_ = auVar262._0_8_ & 0x7fffffff7fffffff;
  auVar151._8_4_ = auVar262._8_4_ & 0x7fffffff;
  auVar151._12_4_ = auVar262._12_4_ & 0x7fffffff;
  auVar185._0_8_ = auVar125._0_8_ & 0x7fffffff7fffffff;
  auVar185._8_4_ = auVar125._8_4_ & 0x7fffffff;
  auVar185._12_4_ = auVar125._12_4_ & 0x7fffffff;
  auVar125 = maxps(auVar151,auVar185);
  fVar238 = auVar125._4_4_;
  if (auVar125._4_4_ <= auVar125._0_4_) {
    fVar238 = auVar125._0_4_;
  }
  fVar238 = fVar238 * 9.536743e-07;
  local_3a8._4_4_ = fVar388;
  local_3a8._0_4_ = fVar380;
  bVar111 = 0;
  uVar119 = 0;
  fVar244 = *(float *)(local_4f8 + k * 4 + 0x30);
  local_538._0_4_ = 0.0;
  local_538._4_4_ = 1.0;
  fStack_530 = 0.0;
  fStack_52c = 0.0;
  local_528.lower = 0.0;
  local_528.upper = 1.0;
  pRVar113 = local_4f8;
LAB_003944d4:
  do {
    fVar253 = 1.0 - (float)local_538._0_4_;
    fVar254 = 1.0 - (float)local_538._0_4_;
    fVar390 = 1.0 - (float)local_538._4_4_;
    fVar392 = 1.0 - (float)local_538._4_4_;
    fVar368 = fVar396 * fVar253 + fVar380 * (float)local_538._0_4_;
    fVar375 = fVar255 * fVar254 + fVar388 * (float)local_538._0_4_;
    fVar376 = fVar396 * fVar390 + fVar380 * (float)local_538._4_4_;
    fVar378 = fVar255 * fVar392 + fVar388 * (float)local_538._4_4_;
    fVar350 = fVar426 * fVar253 + fVar258 * (float)local_538._0_4_;
    fVar363 = fVar436 * fVar254 + fVar300 * (float)local_538._0_4_;
    fVar365 = fVar426 * fVar390 + fVar258 * (float)local_538._4_4_;
    fVar366 = fVar436 * fVar392 + fVar300 * (float)local_538._4_4_;
    fVar440 = fVar259 * fVar253 + fVar327 * (float)local_538._0_4_;
    fVar448 = fVar395 * fVar254 + fVar331 * (float)local_538._0_4_;
    fVar451 = fVar259 * fVar390 + fVar327 * (float)local_538._4_4_;
    fVar453 = fVar395 * fVar392 + fVar331 * (float)local_538._4_4_;
    fVar381 = fVar253 * fVar349 + (float)local_538._0_4_ * fVar243;
    fVar389 = fVar254 * fVar411 + (float)local_538._0_4_ * fVar240;
    fVar391 = fVar390 * fVar349 + (float)local_538._4_4_ * fVar243;
    fVar393 = fVar392 * fVar411 + (float)local_538._4_4_ * fVar240;
    fVar419 = (local_528.upper - local_528.lower) * 0.11111111;
    fVar430 = (local_528.upper - local_528.lower) * 0.0 + local_528.lower;
    fVar434 = (local_528.upper - local_528.lower) * 0.33333334 + local_528.lower;
    fVar435 = (local_528.upper - local_528.lower) * 0.6666667 + local_528.lower;
    fVar437 = (local_528.upper - local_528.lower) * 1.0 + local_528.lower;
    fVar254 = 1.0 - fVar430;
    fVar390 = 1.0 - fVar434;
    fVar241 = 1.0 - fVar435;
    fVar242 = 1.0 - fVar437;
    fVar282 = fVar350 * fVar254 + fVar440 * fVar430;
    fVar295 = fVar350 * fVar390 + fVar440 * fVar434;
    fVar298 = fVar350 * fVar241 + fVar440 * fVar435;
    fVar299 = fVar350 * fVar242 + fVar440 * fVar437;
    fVar301 = fVar363 * fVar254 + fVar448 * fVar430;
    fVar305 = fVar363 * fVar390 + fVar448 * fVar434;
    fVar307 = fVar363 * fVar241 + fVar448 * fVar435;
    fVar308 = fVar363 * fVar242 + fVar448 * fVar437;
    fVar253 = (fVar368 * fVar254 + fVar350 * fVar430) * fVar254 + fVar430 * fVar282;
    fVar392 = (fVar368 * fVar390 + fVar350 * fVar434) * fVar390 + fVar434 * fVar295;
    fVar280 = (fVar368 * fVar241 + fVar350 * fVar435) * fVar241 + fVar435 * fVar298;
    fVar350 = (fVar368 * fVar242 + fVar350 * fVar437) * fVar242 + fVar437 * fVar299;
    fVar368 = (fVar375 * fVar254 + fVar363 * fVar430) * fVar254 + fVar430 * fVar301;
    fVar330 = (fVar375 * fVar390 + fVar363 * fVar434) * fVar390 + fVar434 * fVar305;
    fVar334 = (fVar375 * fVar241 + fVar363 * fVar435) * fVar241 + fVar435 * fVar307;
    fVar375 = (fVar375 * fVar242 + fVar363 * fVar437) * fVar242 + fVar437 * fVar308;
    fVar282 = fVar282 * fVar254 + (fVar440 * fVar254 + fVar381 * fVar430) * fVar430;
    fVar295 = fVar295 * fVar390 + (fVar440 * fVar390 + fVar381 * fVar434) * fVar434;
    fVar363 = fVar298 * fVar241 + (fVar440 * fVar241 + fVar381 * fVar435) * fVar435;
    fVar299 = fVar299 * fVar242 + (fVar440 * fVar242 + fVar381 * fVar437) * fVar437;
    fVar301 = fVar301 * fVar254 + (fVar448 * fVar254 + fVar389 * fVar430) * fVar430;
    fVar305 = fVar305 * fVar390 + (fVar448 * fVar390 + fVar389 * fVar434) * fVar434;
    fVar307 = fVar307 * fVar241 + (fVar448 * fVar241 + fVar389 * fVar435) * fVar435;
    fVar308 = fVar308 * fVar242 + (fVar448 * fVar242 + fVar389 * fVar437) * fVar437;
    local_388 = fVar254 * fVar253 + fVar430 * fVar282;
    fStack_384 = fVar390 * fVar392 + fVar434 * fVar295;
    fStack_380 = fVar241 * fVar280 + fVar435 * fVar363;
    fStack_37c = fVar242 * fVar350 + fVar437 * fVar299;
    fVar398 = fVar254 * fVar368 + fVar430 * fVar301;
    fVar409 = fVar390 * fVar330 + fVar434 * fVar305;
    fVar413 = fVar241 * fVar334 + fVar435 * fVar307;
    fVar416 = fVar242 * fVar375 + fVar437 * fVar308;
    fVar298 = (fVar295 - fVar392) * 3.0 * fVar419;
    fVar363 = (fVar363 - fVar280) * 3.0 * fVar419;
    fVar350 = (fVar299 - fVar350) * 3.0 * fVar419;
    fVar299 = (fVar305 - fVar330) * 3.0 * fVar419;
    fVar305 = (fVar307 - fVar334) * 3.0 * fVar419;
    fVar307 = (fVar308 - fVar375) * 3.0 * fVar419;
    local_358._4_4_ = fStack_380;
    local_358._0_4_ = fStack_384;
    local_358._8_4_ = fStack_37c;
    local_358._12_4_ = 0;
    local_368 = local_388 + (fVar282 - fVar253) * 3.0 * fVar419;
    fStack_364 = fStack_384 + fVar298;
    fStack_360 = fStack_380 + fVar363;
    fStack_35c = fStack_37c + fVar350;
    fVar253 = fVar398 + (fVar301 - fVar368) * 3.0 * fVar419;
    fVar392 = fVar409 + fVar299;
    fVar280 = fVar413 + fVar305;
    fVar295 = fVar416 + fVar307;
    local_378._0_4_ = fStack_384 - fVar298;
    local_378._4_4_ = fStack_380 - fVar363;
    local_378._8_4_ = fStack_37c - fVar350;
    local_378._12_4_ = 0;
    auVar152._0_4_ = fVar409 - fVar299;
    auVar152._4_4_ = fVar413 - fVar305;
    auVar152._8_4_ = fVar416 - fVar307;
    auVar152._12_4_ = 0;
    fVar363 = fVar365 * fVar254 + fVar451 * fVar430;
    fVar299 = fVar365 * fVar390 + fVar451 * fVar434;
    fVar301 = fVar365 * fVar241 + fVar451 * fVar435;
    fVar305 = fVar365 * fVar242 + fVar451 * fVar437;
    fVar307 = fVar366 * fVar254 + fVar453 * fVar430;
    fVar308 = fVar366 * fVar390 + fVar453 * fVar434;
    fVar368 = fVar366 * fVar241 + fVar453 * fVar435;
    fVar330 = fVar366 * fVar242 + fVar453 * fVar437;
    fVar282 = (fVar376 * fVar254 + fVar365 * fVar430) * fVar254 + fVar430 * fVar363;
    fVar350 = (fVar376 * fVar390 + fVar365 * fVar434) * fVar390 + fVar434 * fVar299;
    fVar298 = (fVar376 * fVar241 + fVar365 * fVar435) * fVar241 + fVar435 * fVar301;
    fVar334 = (fVar376 * fVar242 + fVar365 * fVar437) * fVar242 + fVar437 * fVar305;
    fVar440 = (fVar378 * fVar254 + fVar366 * fVar430) * fVar254 + fVar430 * fVar307;
    fVar448 = (fVar378 * fVar390 + fVar366 * fVar434) * fVar390 + fVar434 * fVar308;
    fVar377 = (fVar378 * fVar241 + fVar366 * fVar435) * fVar241 + fVar435 * fVar368;
    fVar379 = (fVar378 * fVar242 + fVar366 * fVar437) * fVar242 + fVar437 * fVar330;
    fVar375 = fVar363 * fVar254 + (fVar451 * fVar254 + fVar391 * fVar430) * fVar430;
    fVar365 = fVar299 * fVar390 + (fVar451 * fVar390 + fVar391 * fVar434) * fVar434;
    fVar366 = fVar301 * fVar241 + (fVar451 * fVar241 + fVar391 * fVar435) * fVar435;
    fVar376 = fVar305 * fVar242 + (fVar451 * fVar242 + fVar391 * fVar437) * fVar437;
    fVar389 = fVar307 * fVar254 + (fVar453 * fVar254 + fVar393 * fVar430) * fVar430;
    fVar378 = fVar308 * fVar390 + (fVar453 * fVar390 + fVar393 * fVar434) * fVar434;
    fVar381 = fVar368 * fVar241 + (fVar453 * fVar241 + fVar393 * fVar435) * fVar435;
    fVar391 = fVar330 * fVar242 + (fVar453 * fVar242 + fVar393 * fVar437) * fVar437;
    fVar307 = fVar254 * fVar282 + fVar430 * fVar375;
    fVar308 = fVar390 * fVar350 + fVar434 * fVar365;
    fVar368 = fVar241 * fVar298 + fVar435 * fVar366;
    fVar330 = fVar242 * fVar334 + fVar437 * fVar376;
    fVar363 = fVar254 * fVar440 + fVar430 * fVar389;
    fVar299 = fVar390 * fVar448 + fVar434 * fVar378;
    fVar301 = fVar241 * fVar377 + fVar435 * fVar381;
    fVar305 = fVar242 * fVar379 + fVar437 * fVar391;
    fVar254 = (fVar365 - fVar350) * 3.0 * fVar419;
    fVar241 = (fVar366 - fVar298) * 3.0 * fVar419;
    fVar350 = (fVar376 - fVar334) * 3.0 * fVar419;
    fVar376 = (fVar378 - fVar448) * 3.0 * fVar419;
    fVar378 = (fVar381 - fVar377) * 3.0 * fVar419;
    fVar381 = (fVar391 - fVar379) * 3.0 * fVar419;
    fVar377 = fVar307 + (fVar375 - fVar282) * 3.0 * fVar419;
    fVar379 = fVar308 + fVar254;
    fVar393 = fVar368 + fVar241;
    fVar430 = fVar330 + fVar350;
    fVar389 = fVar363 + (fVar389 - fVar440) * 3.0 * fVar419;
    fVar391 = fVar299 + fVar376;
    fVar440 = fVar301 + fVar378;
    fVar448 = fVar305 + fVar381;
    fVar254 = fVar308 - fVar254;
    fVar241 = fVar368 - fVar241;
    fVar350 = fVar330 - fVar350;
    fVar376 = fVar299 - fVar376;
    fVar378 = fVar301 - fVar378;
    fVar381 = fVar305 - fVar381;
    fVar390 = (fVar308 - fStack_384) + (fVar307 - local_388);
    fVar242 = (fVar368 - fStack_380) + (fVar308 - fStack_384);
    fVar282 = (fVar330 - fStack_37c) + (fVar368 - fStack_380);
    fVar298 = (fVar330 - fStack_37c) + 0.0;
    fVar334 = (fVar299 - fVar409) + (fVar363 - fVar398);
    fVar375 = (fVar301 - fVar413) + (fVar299 - fVar409);
    fVar365 = (fVar305 - fVar416) + (fVar301 - fVar413);
    fVar366 = (fVar305 - fVar416) + 0.0;
    auVar319._0_8_ =
         CONCAT44(fVar409 * fVar242 - fStack_384 * fVar375,fVar398 * fVar390 - local_388 * fVar334);
    auVar319._8_4_ = fVar413 * fVar282 - fStack_380 * fVar365;
    auVar319._12_4_ = fVar416 * fVar298 - fStack_37c * fVar366;
    auVar268._0_4_ = fVar253 * fVar390 - local_368 * fVar334;
    auVar268._4_4_ = fVar392 * fVar242 - fStack_364 * fVar375;
    auVar268._8_4_ = fVar280 * fVar282 - fStack_360 * fVar365;
    auVar268._12_4_ = fVar295 * fVar298 - fStack_35c * fVar366;
    auVar284._0_8_ =
         CONCAT44(auVar152._4_4_ * fVar242 - fVar375 * local_378._4_4_,
                  auVar152._0_4_ * fVar390 - fVar334 * local_378._0_4_);
    auVar284._8_4_ = auVar152._8_4_ * fVar282 - fVar365 * local_378._8_4_;
    auVar284._12_4_ = fVar298 * 0.0 - fVar366 * 0.0;
    auVar403._0_4_ = fVar390 * fVar409 - fVar334 * fStack_384;
    auVar403._4_4_ = fVar242 * fVar413 - fVar375 * fStack_380;
    auVar403._8_4_ = fVar282 * fVar416 - fVar365 * fStack_37c;
    auVar403._12_4_ = fVar298 * 0.0 - fVar366 * 0.0;
    auVar355._0_8_ =
         CONCAT44(fVar299 * fVar242 - fVar308 * fVar375,fVar363 * fVar390 - fVar307 * fVar334);
    auVar355._8_4_ = fVar301 * fVar282 - fVar368 * fVar365;
    auVar355._12_4_ = fVar305 * fVar298 - fVar330 * fVar366;
    auVar423._0_4_ = fVar389 * fVar390 - fVar377 * fVar334;
    auVar423._4_4_ = fVar391 * fVar242 - fVar379 * fVar375;
    auVar423._8_4_ = fVar440 * fVar282 - fVar393 * fVar365;
    auVar423._12_4_ = fVar448 * fVar298 - fVar430 * fVar366;
    auVar339._0_8_ =
         CONCAT44(fVar378 * fVar242 - fVar375 * fVar241,fVar376 * fVar390 - fVar334 * fVar254);
    auVar339._8_4_ = fVar381 * fVar282 - fVar365 * fVar350;
    auVar339._12_4_ = fVar298 * 0.0 - fVar366 * 0.0;
    auVar162._0_4_ = fVar390 * fVar299 - fVar334 * fVar308;
    auVar162._4_4_ = fVar242 * fVar301 - fVar375 * fVar368;
    auVar162._8_4_ = fVar282 * fVar305 - fVar365 * fVar330;
    auVar162._12_4_ = fVar298 * 0.0 - fVar366 * 0.0;
    auVar186._8_4_ = auVar319._8_4_;
    auVar186._0_8_ = auVar319._0_8_;
    auVar186._12_4_ = auVar319._12_4_;
    auVar125 = minps(auVar186,auVar268);
    auVar184 = maxps(auVar319,auVar268);
    auVar269._8_4_ = auVar284._8_4_;
    auVar269._0_8_ = auVar284._0_8_;
    auVar269._12_4_ = auVar284._12_4_;
    auVar262 = minps(auVar269,auVar403);
    auVar125 = minps(auVar125,auVar262);
    auVar262 = maxps(auVar284,auVar403);
    auVar124 = maxps(auVar184,auVar262);
    auVar270._8_4_ = auVar355._8_4_;
    auVar270._0_8_ = auVar355._0_8_;
    auVar270._12_4_ = auVar355._12_4_;
    auVar262 = minps(auVar270,auVar423);
    auVar356 = maxps(auVar355,auVar423);
    auVar285._8_4_ = auVar339._8_4_;
    auVar285._0_8_ = auVar339._0_8_;
    auVar285._12_4_ = auVar339._12_4_;
    auVar184 = minps(auVar285,auVar162);
    auVar262 = minps(auVar262,auVar184);
    auVar125 = minps(auVar125,auVar262);
    auVar262 = maxps(auVar339,auVar162);
    auVar262 = maxps(auVar356,auVar262);
    auVar262 = maxps(auVar124,auVar262);
    bVar104 = auVar125._4_4_ <= fVar238;
    bVar33 = auVar125._8_4_ <= fVar238;
    auVar92._4_4_ = -(uint)bVar33;
    auVar92._0_4_ = -(uint)bVar104;
    auVar92._8_4_ = -(uint)(auVar125._12_4_ <= fVar238);
    auVar92._12_4_ = 0;
    auVar190 = auVar92 << 0x20;
    bVar96 = (-fVar238 <= auVar262._0_4_ && auVar125._0_4_ <= fVar238) && bVar35;
    auVar320._0_4_ = -(uint)bVar96;
    bVar97 = (-fVar238 <= auVar262._4_4_ && bVar104) && bVar36;
    auVar320._4_4_ = -(uint)bVar97;
    bVar104 = (-fVar238 <= auVar262._8_4_ && bVar33) && bVar37;
    auVar320._8_4_ = -(uint)bVar104;
    auVar320._12_4_ = 0;
    uVar106 = movmskps((int)uVar108,auVar320);
    uVar108 = (ulong)uVar106;
    if (uVar106 != 0) {
      fVar390 = (fVar308 - fVar307) + (fStack_384 - local_388);
      fVar242 = (fVar368 - fVar308) + (fStack_380 - fStack_384);
      fVar282 = (fVar330 - fVar368) + (fStack_37c - fStack_380);
      fVar298 = (0.0 - fVar330) + (0.0 - fStack_37c);
      fVar334 = (fVar299 - fVar363) + (fVar409 - fVar398);
      fVar375 = (fVar301 - fVar299) + (fVar413 - fVar409);
      fVar365 = (fVar305 - fVar301) + (fVar416 - fVar413);
      fVar366 = (0.0 - fVar305) + (0.0 - fVar416);
      auVar431._0_8_ =
           CONCAT44(fVar409 * fVar242 - fStack_384 * fVar375,fVar398 * fVar390 - local_388 * fVar334
                   );
      auVar431._8_4_ = fVar413 * fVar282 - fStack_380 * fVar365;
      auVar431._12_4_ = fVar416 * fVar298 - fStack_37c * fVar366;
      auVar271._0_4_ = fVar253 * fVar390 - local_368 * fVar334;
      auVar271._4_4_ = fVar392 * fVar242 - fStack_364 * fVar375;
      auVar271._8_4_ = fVar280 * fVar282 - fStack_360 * fVar365;
      auVar271._12_4_ = fVar295 * fVar298 - fStack_35c * fVar366;
      auVar340._0_8_ =
           CONCAT44(auVar152._4_4_ * fVar242 - local_378._4_4_ * fVar375,
                    auVar152._0_4_ * fVar390 - local_378._0_4_ * fVar334);
      auVar340._8_4_ = auVar152._8_4_ * fVar282 - local_378._8_4_ * fVar365;
      auVar340._12_4_ = fVar298 * 0.0 - fVar366 * 0.0;
      auVar286._0_4_ = fVar409 * fVar390 - fStack_384 * fVar334;
      auVar286._4_4_ = fVar413 * fVar242 - fStack_380 * fVar375;
      auVar286._8_4_ = fVar416 * fVar282 - fStack_37c * fVar365;
      auVar286._12_4_ = fVar298 * 0.0 - fVar366 * 0.0;
      auVar232._0_8_ =
           CONCAT44(fVar299 * fVar242 - fVar308 * fVar375,fVar363 * fVar390 - fVar307 * fVar334);
      auVar232._8_4_ = fVar301 * fVar282 - fVar368 * fVar365;
      auVar232._12_4_ = fVar305 * fVar298 - fVar330 * fVar366;
      auVar370._0_4_ = fVar389 * fVar390 - fVar377 * fVar334;
      auVar370._4_4_ = fVar391 * fVar242 - fVar379 * fVar375;
      auVar370._8_4_ = fVar440 * fVar282 - fVar393 * fVar365;
      auVar370._12_4_ = fVar448 * fVar298 - fVar430 * fVar366;
      auVar404._0_8_ =
           CONCAT44(fVar378 * fVar242 - fVar241 * fVar375,fVar376 * fVar390 - fVar254 * fVar334);
      auVar404._8_4_ = fVar381 * fVar282 - fVar350 * fVar365;
      auVar404._12_4_ = fVar298 * 0.0 - fVar366 * 0.0;
      auVar162._0_4_ = fVar390 * fVar299 - fVar334 * fVar308;
      auVar162._4_4_ = fVar242 * fVar301 - fVar375 * fVar368;
      auVar162._8_4_ = fVar282 * fVar305 - fVar365 * fVar330;
      auVar162._12_4_ = fVar298 * 0.0 - fVar366 * 0.0;
      auVar187._8_4_ = auVar431._8_4_;
      auVar187._0_8_ = auVar431._0_8_;
      auVar187._12_4_ = auVar431._12_4_;
      auVar125 = minps(auVar187,auVar271);
      auVar184 = maxps(auVar431,auVar271);
      auVar272._8_4_ = auVar340._8_4_;
      auVar272._0_8_ = auVar340._0_8_;
      auVar272._12_4_ = auVar340._12_4_;
      auVar262 = minps(auVar272,auVar286);
      auVar125 = minps(auVar125,auVar262);
      auVar262 = maxps(auVar340,auVar286);
      auVar356 = maxps(auVar184,auVar262);
      auVar273._8_4_ = auVar232._8_4_;
      auVar273._0_8_ = auVar232._0_8_;
      auVar273._12_4_ = auVar232._12_4_;
      auVar184 = minps(auVar273,auVar370);
      auVar262 = maxps(auVar232,auVar370);
      auVar287._8_4_ = auVar404._8_4_;
      auVar287._0_8_ = auVar404._0_8_;
      auVar287._12_4_ = auVar404._12_4_;
      auVar124 = minps(auVar287,auVar162);
      auVar184 = minps(auVar184,auVar124);
      auVar125 = minps(auVar125,auVar184);
      auVar184 = maxps(auVar404,auVar162);
      auVar262 = maxps(auVar262,auVar184);
      auVar262 = maxps(auVar356,auVar262);
      bVar33 = auVar125._4_4_ <= fVar238;
      bVar34 = auVar125._8_4_ <= fVar238;
      auVar93._4_4_ = -(uint)bVar34;
      auVar93._0_4_ = -(uint)bVar33;
      auVar93._8_4_ = -(uint)(auVar125._12_4_ <= fVar238);
      auVar93._12_4_ = 0;
      auVar190 = auVar93 << 0x20;
      auVar432._0_4_ = -(uint)((-fVar238 <= auVar262._0_4_ && auVar125._0_4_ <= fVar238) && bVar96);
      auVar432._4_4_ = -(uint)((-fVar238 <= auVar262._4_4_ && bVar33) && bVar97);
      auVar432._8_4_ = -(uint)((-fVar238 <= auVar262._8_4_ && bVar34) && bVar104);
      auVar432._12_4_ = 0;
      uVar106 = movmskps(uVar106,auVar432);
      uVar108 = (ulong)uVar106;
      if (uVar106 != 0) {
        uVar108 = (ulong)(byte)uVar106;
        mask_stack[uVar119] = uVar106 & 0xff;
        cu_stack[uVar119] = local_528;
        cv_stack[uVar119].lower = (float)local_538._0_4_;
        cv_stack[uVar119].upper = (float)local_538._4_4_;
        uVar119 = uVar119 + 1;
        auVar162 = _local_538;
      }
    }
LAB_00394b45:
    _local_508 = auVar152;
    auVar125 = _local_508;
    if (uVar119 == 0) {
      if (bVar111 != 0) goto LAB_00395cc3;
      fVar167 = *(float *)(pRVar113 + k * 4 + 0x80);
      auVar198._4_4_ = -(uint)(fVar121 <= fVar167);
      auVar198._0_4_ = -(uint)(fVar410 <= fVar167);
      auVar198._8_4_ = -(uint)(fVar165 <= fVar167);
      auVar198._12_4_ = -(uint)(fVar166 <= fVar167);
      uVar117 = movmskps((int)uVar108,auVar198);
      uVar116 = uVar116 & uVar116 + 0xf & uVar117;
      goto LAB_00393643;
    }
    uVar106 = uVar119 - 1;
    uVar108 = (ulong)uVar106;
    uVar114 = mask_stack[uVar108];
    local_538._0_4_ = cv_stack[uVar108].lower;
    local_538._4_4_ = cv_stack[uVar108].upper;
    fStack_530 = 0.0;
    fStack_52c = 0.0;
    uVar14 = 0;
    if (uVar114 != 0) {
      for (; (uVar114 >> uVar14 & 1) == 0; uVar14 = uVar14 + 1) {
      }
    }
    uVar114 = uVar114 - 1 & uVar114;
    mask_stack[uVar108] = uVar114;
    if (uVar114 == 0) {
      uVar119 = uVar106;
    }
    fVar390 = (float)(uVar14 + 1) * 0.33333334;
    fVar392 = auVar162._4_4_ * 0.0;
    fVar241 = auVar190._4_4_ * 0.0;
    fVar253 = cu_stack[uVar108].lower;
    fVar254 = cu_stack[uVar108].upper;
    local_528.lower =
         fVar253 * (1.0 - (float)uVar14 * 0.33333334) + fVar254 * (float)uVar14 * 0.33333334;
    local_528.upper = fVar253 * (1.0 - fVar390) + fVar254 * fVar390;
    fVar390 = fVar253 * (0.0 - fVar392) + fVar254 * fVar392;
    fVar254 = fVar253 * (0.0 - fVar241) + fVar254 * fVar241;
    fVar253 = local_528.upper - local_528.lower;
    if (fVar253 < 0.16666667) {
      fVar282 = 1.0 - (float)local_538._0_4_;
      fVar298 = 1.0 - (float)local_538._0_4_;
      fVar301 = 1.0 - (float)local_538._4_4_;
      fVar305 = 1.0 - (float)local_538._4_4_;
      fVar350 = fVar396 * fVar282 + fVar380 * (float)local_538._0_4_;
      fVar295 = fVar255 * fVar298 + fVar388 * (float)local_538._0_4_;
      fVar363 = fVar396 * fVar301 + fVar380 * (float)local_538._4_4_;
      fVar299 = fVar255 * fVar305 + fVar388 * (float)local_538._4_4_;
      fVar392 = fVar426 * fVar282 + fVar258 * (float)local_538._0_4_;
      fVar241 = fVar436 * fVar298 + fVar300 * (float)local_538._0_4_;
      fVar242 = fVar426 * fVar301 + fVar258 * (float)local_538._4_4_;
      fVar280 = fVar436 * fVar305 + fVar300 * (float)local_538._4_4_;
      fVar376 = fVar259 * fVar282 + fVar327 * (float)local_538._0_4_;
      fVar381 = fVar395 * fVar298 + fVar331 * (float)local_538._0_4_;
      fVar391 = fVar259 * fVar301 + fVar327 * (float)local_538._4_4_;
      fVar448 = fVar395 * fVar305 + fVar331 * (float)local_538._4_4_;
      fVar334 = (fVar282 * fVar349 + (float)local_538._0_4_ * fVar243) - fVar376;
      fVar375 = (fVar298 * fVar411 + (float)local_538._0_4_ * fVar240) - fVar381;
      fVar365 = (fVar301 * fVar349 + (float)local_538._4_4_ * fVar243) - fVar391;
      fVar366 = (fVar305 * fVar411 + (float)local_538._4_4_ * fVar240) - fVar448;
      fVar282 = local_528.lower * (fVar376 - fVar392) + fVar392;
      fVar298 = local_528.lower * (fVar381 - fVar241) + fVar241;
      fVar301 = local_528.lower * (fVar391 - fVar242) + fVar242;
      fVar305 = local_528.lower * (fVar448 - fVar280) + fVar280;
      fVar378 = (fVar376 - fVar392) * local_528.upper + fVar392;
      fVar389 = (fVar381 - fVar241) * local_528.upper + fVar241;
      fVar440 = (fVar391 - fVar242) * local_528.upper + fVar242;
      fVar377 = (fVar448 - fVar280) * local_528.upper + fVar280;
      fVar307 = local_528.lower * (fVar392 - fVar350) + fVar350;
      fVar308 = local_528.lower * (fVar241 - fVar295) + fVar295;
      fVar368 = local_528.lower * (fVar242 - fVar363) + fVar363;
      fVar330 = local_528.lower * (fVar280 - fVar299) + fVar299;
      fVar307 = (fVar282 - fVar307) * local_528.lower + fVar307;
      fVar308 = (fVar298 - fVar308) * local_528.lower + fVar308;
      fVar368 = (fVar301 - fVar368) * local_528.lower + fVar368;
      fVar330 = (fVar305 - fVar330) * local_528.lower + fVar330;
      fVar282 = (((local_528.lower * fVar334 + fVar376) - fVar282) * local_528.lower + fVar282) -
                fVar307;
      fVar298 = (((local_528.lower * fVar375 + fVar381) - fVar298) * local_528.lower + fVar298) -
                fVar308;
      fVar301 = (((local_528.lower * fVar365 + fVar391) - fVar301) * local_528.lower + fVar301) -
                fVar368;
      fVar305 = (((local_528.lower * fVar366 + fVar448) - fVar305) * local_528.lower + fVar305) -
                fVar330;
      fVar307 = local_528.lower * fVar282 + fVar307;
      fVar308 = local_528.lower * fVar298 + fVar308;
      fVar368 = local_528.lower * fVar301 + fVar368;
      fVar330 = local_528.lower * fVar305 + fVar330;
      fVar350 = (fVar392 - fVar350) * local_528.upper + fVar350;
      fVar295 = (fVar241 - fVar295) * local_528.upper + fVar295;
      fVar363 = (fVar242 - fVar363) * local_528.upper + fVar363;
      fVar299 = (fVar280 - fVar299) * local_528.upper + fVar299;
      fVar350 = (fVar378 - fVar350) * local_528.upper + fVar350;
      fVar295 = (fVar389 - fVar295) * local_528.upper + fVar295;
      fVar363 = (fVar440 - fVar363) * local_528.upper + fVar363;
      fVar299 = (fVar377 - fVar299) * local_528.upper + fVar299;
      fVar241 = (((fVar334 * local_528.upper + fVar376) - fVar378) * local_528.upper + fVar378) -
                fVar350;
      fVar242 = (((fVar375 * local_528.upper + fVar381) - fVar389) * local_528.upper + fVar389) -
                fVar295;
      fVar280 = (((fVar365 * local_528.upper + fVar391) - fVar440) * local_528.upper + fVar440) -
                fVar363;
      fVar389 = (((fVar366 * local_528.upper + fVar448) - fVar377) * local_528.upper + fVar377) -
                fVar299;
      fVar350 = local_528.upper * fVar241 + fVar350;
      fVar295 = local_528.upper * fVar242 + fVar295;
      fVar363 = local_528.upper * fVar280 + fVar363;
      fVar299 = local_528.upper * fVar389 + fVar299;
      fVar392 = fVar253 * 0.33333334;
      fVar334 = fVar282 * (float)DAT_01f4afa0 * fVar392 + fVar307;
      fVar375 = fVar298 * DAT_01f4afa0._4_4_ * fVar392 + fVar308;
      fVar365 = fVar301 * DAT_01f4afa0._8_4_ * fVar392 + fVar368;
      fVar366 = fVar305 * DAT_01f4afa0._12_4_ * fVar392 + fVar330;
      fVar376 = fVar350 - fVar392 * fVar241 * (float)DAT_01f4afa0;
      fVar378 = fVar295 - fVar392 * fVar242 * DAT_01f4afa0._4_4_;
      fVar381 = fVar363 - fVar392 * fVar280 * DAT_01f4afa0._8_4_;
      fVar389 = fVar299 - fVar392 * fVar389 * DAT_01f4afa0._12_4_;
      auVar40._4_8_ = DAT_01f4afa0._8_8_;
      auVar40._0_4_ = fVar295;
      auVar341._0_8_ = auVar40._0_8_ << 0x20;
      auVar341._8_4_ = fVar363;
      auVar341._12_4_ = fVar299;
      fVar282 = (fVar363 - fVar350) + (fVar368 - fVar307);
      fVar298 = (fVar299 - fVar295) + (fVar330 - fVar308);
      auVar357._0_4_ = fVar378 * fVar298;
      auVar357._4_4_ = fVar378 * fVar298;
      auVar357._8_4_ = fVar389 * fVar298;
      auVar357._12_4_ = fVar389 * fVar298;
      fVar392 = fVar307 * fVar282 + fVar308 * fVar298;
      fVar241 = fVar368 * fVar282 + fVar330 * fVar298;
      fVar301 = fVar334 * fVar282 + fVar375 * fVar298;
      fVar305 = fVar365 * fVar282 + fVar366 * fVar298;
      fVar391 = fVar376 * fVar282 + auVar357._0_4_;
      auVar321._0_8_ = CONCAT44(fVar378 * fVar282 + auVar357._4_4_,fVar391);
      auVar321._8_4_ = fVar381 * fVar282 + auVar357._8_4_;
      auVar321._12_4_ = fVar389 * fVar282 + auVar357._12_4_;
      fVar280 = fVar282 * fVar350 + fVar298 * fVar295;
      fVar440 = fVar282 * fVar363 + fVar298 * fVar299;
      auVar41._4_8_ = auVar357._8_8_;
      auVar41._0_4_ = fVar375 * fVar282 + fVar375 * fVar298;
      auVar358._0_8_ = auVar41._0_8_ << 0x20;
      auVar358._8_4_ = fVar305;
      auVar358._12_4_ = fVar366 * fVar282 + fVar366 * fVar298;
      fVar242 = fVar301;
      if (fVar301 <= fVar392) {
        fVar242 = fVar392;
        fVar392 = fVar301;
      }
      auVar359._8_8_ = auVar358._8_8_;
      auVar359._0_8_ = auVar359._8_8_;
      auVar153._8_4_ = auVar321._8_4_;
      auVar153._0_8_ = auVar321._0_8_;
      auVar153._12_4_ = auVar321._12_4_;
      if (fVar280 <= fVar391) {
        auVar153._0_4_ = fVar280;
      }
      if (auVar153._0_4_ <= fVar392) {
        fVar392 = auVar153._0_4_;
      }
      auVar42._4_8_ = auVar153._8_8_;
      auVar42._0_4_ = fVar282 * fVar295 + fVar298 * fVar295;
      auVar154._0_8_ = auVar42._0_8_ << 0x20;
      auVar154._8_4_ = fVar440;
      auVar154._12_4_ = fVar282 * fVar299 + fVar298 * fVar299;
      if (fVar280 <= fVar391) {
        fVar280 = fVar391;
      }
      auVar162._8_8_ = auVar154._8_8_;
      auVar162._0_8_ = auVar162._8_8_;
      if (fVar280 <= fVar242) {
        fVar280 = fVar242;
      }
      if (fVar305 <= fVar241) {
        auVar359._0_4_ = fVar241;
        fVar241 = fVar305;
      }
      auVar188._8_4_ = auVar321._8_4_;
      auVar188._0_8_ = auVar321._8_8_;
      auVar188._12_4_ = auVar321._12_4_;
      if (fVar440 <= auVar321._8_4_) {
        auVar188._0_4_ = fVar440;
      }
      if (auVar188._0_4_ <= fVar241) {
        fVar241 = auVar188._0_4_;
      }
      if (fVar440 <= auVar321._8_4_) {
        auVar162._0_4_ = auVar321._8_4_;
      }
      if (auVar162._0_4_ <= auVar359._0_4_) {
        auVar162._0_4_ = auVar359._0_4_;
      }
      uVar43 = (undefined3)(uVar106 >> 8);
      uVar108 = (ulong)CONCAT31(uVar43,3 < uVar119);
      fVar242 = auVar162._0_4_;
      if ((0.0001 <= fVar392) || (fVar242 <= -0.0001)) break;
      goto LAB_00394e9d;
    }
  } while( true );
  auVar190._0_12_ = ZEXT812(0x38d1b717);
  auVar190._12_4_ = 0;
  if ((fVar241 < 0.0001 && -0.0001 < fVar280) ||
     ((fVar392 < 0.0001 && -0.0001 < fVar280 ||
      (auVar152 = _local_508, fVar241 < 0.0001 && -0.0001 < fVar242)))) {
LAB_00394e9d:
    local_508 = (undefined1  [8])auVar341._8_8_;
    auVar152 = _local_508;
    local_4f8 = (RayK<4> *)CONCAT44(fVar299,fVar363);
    bVar104 = 3 < uVar119 || fVar253 < 0.001;
    uVar108 = (ulong)CONCAT31(uVar43,bVar104);
    fVar298 = (float)(~-(uint)(fVar392 < 0.0) & 0x3f800000 | -(uint)(fVar392 < 0.0) & 0xbf800000);
    fVar301 = (float)(~-(uint)(fVar280 < 0.0) & 0x3f800000 | -(uint)(fVar280 < 0.0) & 0xbf800000);
    fVar282 = 0.0;
    if ((fVar298 == fVar301) && (!NAN(fVar298) && !NAN(fVar301))) {
      fVar282 = INFINITY;
    }
    fVar305 = 0.0;
    if ((fVar298 == fVar301) && (!NAN(fVar298) && !NAN(fVar301))) {
      fVar305 = -INFINITY;
    }
    fVar391 = (float)(~-(uint)(fVar241 < 0.0) & 0x3f800000 | -(uint)(fVar241 < 0.0) & 0xbf800000);
    if ((fVar298 != fVar391) || (fVar440 = fVar305, NAN(fVar298) || NAN(fVar391))) {
      if ((fVar241 != fVar392) || (NAN(fVar241) || NAN(fVar392))) {
        fVar241 = -fVar392 / (fVar241 - fVar392);
        fVar241 = (1.0 - fVar241) * 0.0 + fVar241;
        fVar440 = fVar241;
      }
      else {
        fVar241 = 0.0;
        if ((fVar392 != 0.0) || (fVar440 = 1.0, NAN(fVar392))) {
          fVar241 = INFINITY;
          fVar440 = -INFINITY;
        }
      }
      if (fVar241 <= fVar282) {
        fVar282 = fVar241;
      }
      if (fVar440 <= fVar305) {
        fVar440 = fVar305;
      }
    }
    fVar392 = *(float *)(&DAT_01f4bed4 + (ulong)(fVar242 < 0.0) * 4);
    if ((fVar301 != fVar392) || (fVar241 = fVar440, NAN(fVar301) || NAN(fVar392))) {
      if ((fVar242 != fVar280) || (NAN(fVar242) || NAN(fVar280))) {
        fVar298 = -fVar280 / (fVar242 - fVar280);
        fVar298 = (1.0 - fVar298) * 0.0 + fVar298;
        fVar241 = fVar298;
      }
      else {
        fVar298 = 0.0;
        if ((fVar280 != 0.0) || (fVar241 = 1.0, NAN(fVar280))) {
          fVar298 = INFINITY;
          fVar241 = -INFINITY;
        }
      }
      if (fVar298 <= fVar282) {
        fVar282 = fVar298;
      }
      if (fVar241 <= fVar440) {
        fVar241 = fVar440;
      }
    }
    if ((fVar391 != fVar392) || (NAN(fVar391) || NAN(fVar392))) {
      fVar282 = (float)(~-(uint)(fVar282 < 1.0) & 0x3f800000 |
                       (uint)fVar282 & -(uint)(fVar282 < 1.0));
      fVar241 = (float)(~-(uint)(fVar241 < 1.0) & (uint)fVar241 |
                       -(uint)(fVar241 < 1.0) & 0x3f800000);
    }
    auVar189._0_8_ =
         CONCAT44(~-(uint)(fVar241 < 1.0),~-(uint)(fVar282 < 0.0) & (uint)fVar282) &
         0x3f800000ffffffff;
    auVar189._8_8_ = 0;
    auVar190 = auVar189 | ZEXT416((uint)fVar241 & -(uint)(fVar241 < 1.0)) << 0x20;
    fVar392 = auVar190._4_4_;
    auVar162._4_4_ = fVar392;
    auVar162._0_4_ = fVar392;
    auVar162._8_4_ = fVar392;
    auVar162._12_4_ = fVar392;
    fStack_500 = auVar125._8_4_;
    fStack_4fc = auVar125._12_4_;
    if (auVar190._0_4_ <= fVar392) {
      fVar241 = auVar190._0_4_ + -0.1;
      fVar280 = auVar190._8_4_ + 0.0;
      fVar282 = auVar190._12_4_ + 0.0;
      uVar106 = -(uint)(fVar392 + 0.1 < 1.0);
      fVar241 = (float)(~-(uint)(fVar241 < 0.0) & (uint)fVar241);
      fVar392 = (float)(~uVar106 & 0x3f800000 | (uint)(fVar392 + 0.1) & uVar106);
      fVar391 = 1.0 - fVar241;
      fVar440 = 1.0 - fVar241;
      fVar448 = 1.0 - fVar392;
      fVar377 = 1.0 - fVar392;
      fVar298 = fVar307 * fVar391 + fVar368 * fVar241;
      fVar301 = fVar308 * fVar440 + fVar330 * fVar241;
      fVar305 = fVar307 * fVar448 + fVar368 * fVar392;
      fVar307 = fVar308 * fVar377 + fVar330 * fVar392;
      fVar308 = fVar334 * fVar391 + fVar365 * fVar241;
      fVar368 = fVar375 * fVar440 + fVar366 * fVar241;
      fVar330 = fVar334 * fVar448 + fVar365 * fVar392;
      fVar334 = fVar375 * fVar377 + fVar366 * fVar392;
      fVar375 = fVar376 * fVar391 + fVar381 * fVar241;
      fVar365 = fVar378 * fVar440 + fVar389 * fVar241;
      fVar366 = fVar376 * fVar448 + fVar381 * fVar392;
      fVar376 = fVar378 * fVar377 + fVar389 * fVar392;
      fVar363 = fVar391 * fVar350 + fVar363 * fVar241;
      fVar299 = fVar440 * fVar295 + fVar299 * fVar241;
      fVar378 = fVar448 * fVar350 + fStack_500 * fVar392;
      fVar381 = fVar377 * fVar295 + fStack_4fc * fVar392;
      fVar350 = (float)local_538._4_4_ * fVar280;
      fVar295 = (float)local_538._4_4_ * fVar282;
      fVar389 = (float)local_538._0_4_ * (1.0 - fVar392);
      fStack_530 = (float)local_538._0_4_ * (0.0 - fVar280);
      fStack_52c = (float)local_538._0_4_ * (0.0 - fVar282);
      local_538._0_4_ = (float)local_538._0_4_ * (1.0 - fVar241) + (float)local_538._4_4_ * fVar241;
      local_538._4_4_ = fVar389 + (float)local_538._4_4_ * fVar392;
      fStack_530 = fStack_530 + fVar350;
      fStack_52c = fStack_52c + fVar295;
      fVar253 = 1.0 / fVar253;
      auVar191._0_4_ = fVar378 - fVar363;
      auVar191._4_4_ = fVar381 - fVar299;
      auVar191._8_4_ = fVar378 - fVar378;
      auVar191._12_4_ = fVar381 - fVar381;
      auVar251._0_8_ = CONCAT44(fVar376 - fVar365,fVar366 - fVar375);
      auVar251._8_4_ = fVar366 - fVar366;
      auVar251._12_4_ = fVar376 - fVar376;
      auVar288._0_4_ = fVar330 - fVar308;
      auVar288._4_4_ = fVar334 - fVar368;
      auVar288._8_4_ = fVar330 - fVar330;
      auVar288._12_4_ = fVar334 - fVar334;
      auVar360._0_8_ = CONCAT44((fVar368 - fVar301) * 3.0,(fVar308 - fVar298) * 3.0);
      auVar360._8_4_ = (fVar330 - fVar305) * 3.0;
      auVar360._12_4_ = (fVar334 - fVar307) * 3.0;
      auVar274._0_8_ = CONCAT44((fVar365 - fVar368) * 3.0,(fVar375 - fVar308) * 3.0);
      auVar274._8_4_ = (fVar366 - fVar330) * 3.0;
      auVar274._12_4_ = (fVar376 - fVar334) * 3.0;
      auVar383._0_4_ = (fVar363 - fVar375) * 3.0;
      auVar383._4_4_ = (fVar299 - fVar365) * 3.0;
      auVar383._8_4_ = (fVar378 - fVar366) * 3.0;
      auVar383._12_4_ = (fVar381 - fVar376) * 3.0;
      auVar322._8_4_ = auVar274._8_4_;
      auVar322._0_8_ = auVar274._0_8_;
      auVar322._12_4_ = auVar274._12_4_;
      auVar262 = minps(auVar322,auVar383);
      auVar125 = maxps(auVar274,auVar383);
      auVar371._8_4_ = auVar360._8_4_;
      auVar371._0_8_ = auVar360._0_8_;
      auVar371._12_4_ = auVar360._12_4_;
      auVar124 = minps(auVar371,auVar262);
      auVar184 = maxps(auVar360,auVar125);
      auVar44._4_8_ = auVar125._8_8_;
      auVar44._0_4_ = auVar124._4_4_;
      auVar275._0_8_ = auVar44._0_8_ << 0x20;
      auVar275._8_4_ = auVar124._8_4_;
      auVar275._12_4_ = auVar124._12_4_;
      auVar276._8_8_ = auVar124._8_8_;
      auVar276._0_8_ = auVar275._8_8_;
      auVar45._4_8_ = auVar262._8_8_;
      auVar45._0_4_ = auVar184._4_4_;
      auVar323._0_8_ = auVar45._0_8_ << 0x20;
      auVar323._8_4_ = auVar184._8_4_;
      auVar323._12_4_ = auVar184._12_4_;
      auVar324._8_8_ = auVar184._8_8_;
      auVar324._0_8_ = auVar323._8_8_;
      auVar262 = minps(auVar124,auVar276);
      auVar125 = maxps(auVar184,auVar324);
      fVar391 = auVar262._0_4_ * fVar253;
      fVar440 = auVar262._4_4_ * fVar253;
      fVar448 = auVar262._8_4_ * fVar253;
      fVar377 = auVar262._12_4_ * fVar253;
      fVar308 = fVar253 * auVar125._0_4_;
      fVar330 = fVar253 * auVar125._4_4_;
      fVar375 = fVar253 * auVar125._8_4_;
      fVar253 = fVar253 * auVar125._12_4_;
      fVar381 = 1.0 / ((float)local_538._4_4_ - (float)local_538._0_4_);
      auVar155._0_8_ = CONCAT44(fVar307 - fVar301,fVar305 - fVar298);
      auVar155._8_4_ = fVar305 - fVar305;
      auVar155._12_4_ = fVar307 - fVar307;
      auVar342._8_4_ = auVar155._8_4_;
      auVar342._0_8_ = auVar155._0_8_;
      auVar342._12_4_ = auVar155._12_4_;
      auVar184 = minps(auVar342,auVar288);
      auVar125 = maxps(auVar155,auVar288);
      auVar233._8_4_ = auVar251._8_4_;
      auVar233._0_8_ = auVar251._0_8_;
      auVar233._12_4_ = auVar251._12_4_;
      auVar262 = minps(auVar233,auVar191);
      auVar184 = minps(auVar184,auVar262);
      auVar262 = maxps(auVar251,auVar191);
      auVar125 = maxps(auVar125,auVar262);
      fVar376 = auVar184._0_4_ * fVar381;
      fVar378 = auVar184._4_4_ * fVar381;
      fVar389 = fVar381 * auVar125._0_4_;
      fVar381 = fVar381 * auVar125._4_4_;
      local_508._4_4_ = local_538._0_4_;
      local_508._0_4_ = local_528.lower;
      fStack_500 = local_528.upper;
      fStack_4fc = (float)local_538._4_4_;
      auVar325._4_4_ = local_538._4_4_;
      auVar325._0_4_ = local_528.upper;
      auVar325._8_4_ = fVar390;
      auVar325._12_4_ = fVar254;
      fVar299 = (local_528.lower + local_528.upper) * 0.5;
      fVar301 = ((float)local_538._0_4_ + (float)local_538._4_4_) * 0.5;
      fVar305 = (local_528.upper + fVar390) * 0.0;
      fVar307 = ((float)local_538._4_4_ + fVar254) * 0.0;
      fVar392 = (fVar426 - fVar396) * fVar299 + fVar396;
      fVar241 = (fVar436 - fVar255) * fVar299 + fVar255;
      fVar280 = (fVar258 - fVar380) * fVar299 + p00_1.field_0.v[2];
      fVar350 = (fVar300 - fVar388) * fVar299 + p00_1.field_0.v[3];
      fVar282 = (fVar259 - fVar426) * fVar299 + fVar327;
      fVar295 = (fVar395 - fVar436) * fVar299 + fVar331;
      fVar298 = (fVar327 - fVar258) * fVar299 + fVar258;
      fVar363 = (fVar331 - fVar300) * fVar299 + fVar300;
      fVar392 = (fVar282 - fVar392) * fVar299 + fVar392;
      fVar241 = (fVar295 - fVar241) * fVar299 + fVar241;
      fVar280 = (fVar298 - fVar280) * fVar299 + fVar280;
      fVar350 = (fVar363 - fVar350) * fVar299 + fVar350;
      fVar282 = ((((fVar349 - fVar259) * fVar299 + fVar259) - fVar282) * fVar299 + fVar282) -
                fVar392;
      fVar295 = ((((fVar411 - fVar395) * fVar299 + fVar395) - fVar295) * fVar299 + fVar295) -
                fVar241;
      fVar298 = ((((fVar243 - fVar327) * fVar299 + p02.field_0.v[2]) - fVar298) * fVar299 + fVar298)
                - fVar280;
      fVar363 = ((((fVar240 - fVar331) * fVar299 + p02.field_0.v[3]) - fVar363) * fVar299 + fVar363)
                - fVar350;
      fVar392 = fVar299 * fVar282 + fVar392;
      fVar241 = fVar299 * fVar295 + fVar241;
      fVar282 = fVar282 * 3.0;
      fVar295 = fVar295 * 3.0;
      fVar280 = (fVar299 * fVar298 + fVar280) - fVar392;
      fVar350 = (fVar299 * fVar363 + fVar350) - fVar241;
      fVar282 = (fVar298 * 3.0 - fVar282) * fVar301 + fVar282;
      fVar295 = (fVar363 * 3.0 - fVar295) * fVar301 + fVar295;
      auVar252._0_8_ = CONCAT44(fVar282,fVar280) ^ 0x80000000;
      auVar252._8_4_ = fVar282;
      auVar252._12_4_ = fVar282;
      fVar379 = local_528.lower - fVar299;
      fVar393 = (float)local_538._0_4_ - fVar301;
      fVar398 = local_528.upper - fVar305;
      fVar409 = (float)local_538._4_4_ - fVar307;
      fVar413 = local_528.upper - fVar299;
      fVar416 = (float)local_538._4_4_ - fVar301;
      fVar390 = fVar390 - fVar305;
      fVar254 = fVar254 - fVar307;
      fVar392 = fVar280 * fVar301 + fVar392;
      fVar241 = fVar350 * fVar301 + fVar241;
      auVar277._0_8_ = CONCAT44(fVar295,fVar350) ^ 0x8000000000000000;
      auVar277._8_4_ = -fVar295;
      auVar277._12_4_ = -fVar295;
      auVar156._0_4_ = fVar350 * fVar282 - fVar295 * fVar280;
      auVar156._4_4_ = auVar156._0_4_;
      auVar156._8_4_ = auVar156._0_4_;
      auVar156._12_4_ = auVar156._0_4_;
      auVar262 = divps(auVar277,auVar156);
      auVar125 = divps(auVar252,auVar156);
      fVar305 = auVar262._0_4_;
      fVar307 = auVar262._4_4_;
      fVar298 = auVar125._0_4_;
      fVar363 = auVar125._4_4_;
      fVar299 = fVar299 - (fVar241 * fVar298 + fVar392 * fVar305);
      fVar282 = fVar301 - (fVar241 * fVar363 + fVar392 * fVar307);
      fVar295 = fVar301 - (fVar241 * auVar125._8_4_ + fVar392 * auVar262._8_4_);
      fVar301 = fVar301 - (fVar241 * auVar125._12_4_ + fVar392 * auVar262._12_4_);
      auVar192._0_8_ = CONCAT44(fVar307 * fVar376,fVar307 * fVar391);
      auVar192._8_4_ = fVar307 * fVar440;
      auVar192._12_4_ = fVar307 * fVar378;
      auVar157._0_4_ = fVar307 * fVar308;
      auVar157._4_4_ = fVar307 * fVar389;
      auVar157._8_4_ = fVar307 * fVar330;
      auVar157._12_4_ = fVar307 * fVar381;
      auVar445._8_4_ = auVar192._8_4_;
      auVar445._0_8_ = auVar192._0_8_;
      auVar445._12_4_ = auVar192._12_4_;
      auVar124 = minps(auVar445,auVar157);
      auVar125 = maxps(auVar157,auVar192);
      auVar289._0_8_ = CONCAT44(fVar363 * fVar378,fVar363 * fVar440);
      auVar289._8_4_ = fVar363 * fVar448;
      auVar289._12_4_ = fVar363 * fVar377;
      auVar193._0_4_ = fVar363 * fVar330;
      auVar193._4_4_ = fVar363 * fVar381;
      auVar193._8_4_ = fVar363 * fVar375;
      auVar193._12_4_ = fVar363 * fVar253;
      auVar372._8_4_ = auVar289._8_4_;
      auVar372._0_8_ = auVar289._0_8_;
      auVar372._12_4_ = auVar289._12_4_;
      auVar184 = minps(auVar372,auVar193);
      auVar262 = maxps(auVar193,auVar289);
      fVar392 = 0.0 - (auVar262._0_4_ + auVar125._0_4_);
      fVar241 = 1.0 - (auVar262._4_4_ + auVar125._4_4_);
      fVar280 = 0.0 - (auVar262._8_4_ + auVar125._8_4_);
      fVar350 = 0.0 - (auVar262._12_4_ + auVar125._12_4_);
      fVar368 = 0.0 - (auVar184._0_4_ + auVar124._0_4_);
      fVar334 = 1.0 - (auVar184._4_4_ + auVar124._4_4_);
      fVar365 = 0.0 - (auVar184._8_4_ + auVar124._8_4_);
      fVar366 = 0.0 - (auVar184._12_4_ + auVar124._12_4_);
      auVar194._0_8_ = CONCAT44(fVar393 * fVar241,fVar379 * fVar392);
      auVar194._8_4_ = fVar398 * fVar280;
      auVar194._12_4_ = fVar409 * fVar350;
      auVar384._0_8_ = CONCAT44(fVar376 * fVar305,fVar391 * fVar305);
      auVar384._8_4_ = fVar440 * fVar305;
      auVar384._12_4_ = fVar378 * fVar305;
      auVar290._0_4_ = fVar305 * fVar308;
      auVar290._4_4_ = fVar305 * fVar389;
      auVar290._8_4_ = fVar305 * fVar330;
      auVar290._12_4_ = fVar305 * fVar381;
      auVar373._8_4_ = auVar384._8_4_;
      auVar373._0_8_ = auVar384._0_8_;
      auVar373._12_4_ = auVar384._12_4_;
      auVar262 = minps(auVar373,auVar290);
      auVar125 = maxps(auVar290,auVar384);
      auVar343._0_8_ = CONCAT44(fVar378 * fVar298,fVar440 * fVar298);
      auVar343._8_4_ = fVar448 * fVar298;
      auVar343._12_4_ = fVar377 * fVar298;
      auVar385._0_4_ = fVar298 * fVar330;
      auVar385._4_4_ = fVar298 * fVar381;
      auVar385._8_4_ = fVar298 * fVar375;
      auVar385._12_4_ = fVar298 * fVar253;
      auVar433._8_4_ = auVar343._8_4_;
      auVar433._0_8_ = auVar343._0_8_;
      auVar433._12_4_ = auVar343._12_4_;
      auVar124 = minps(auVar433,auVar385);
      auVar374._0_4_ = fVar379 * fVar368;
      auVar374._4_4_ = fVar393 * fVar334;
      auVar374._8_4_ = fVar398 * fVar365;
      auVar374._12_4_ = fVar409 * fVar366;
      auVar158._0_8_ = CONCAT44(fVar241 * fVar416,fVar392 * fVar413);
      auVar158._8_4_ = fVar280 * fVar390;
      auVar158._12_4_ = fVar350 * fVar254;
      auVar302._0_4_ = fVar368 * fVar413;
      auVar302._4_4_ = fVar334 * fVar416;
      auVar302._8_4_ = fVar365 * fVar390;
      auVar302._12_4_ = fVar366 * fVar254;
      auVar184 = maxps(auVar385,auVar343);
      fVar253 = 1.0 - (auVar184._0_4_ + auVar125._0_4_);
      fVar392 = 0.0 - (auVar184._4_4_ + auVar125._4_4_);
      fVar241 = 0.0 - (auVar184._8_4_ + auVar125._8_4_);
      fVar280 = 0.0 - (auVar184._12_4_ + auVar125._12_4_);
      fVar350 = 1.0 - (auVar124._0_4_ + auVar262._0_4_);
      fVar308 = 0.0 - (auVar124._4_4_ + auVar262._4_4_);
      fVar368 = 0.0 - (auVar124._8_4_ + auVar262._8_4_);
      fVar330 = 0.0 - (auVar124._12_4_ + auVar262._12_4_);
      auVar344._0_8_ = CONCAT44(fVar393 * fVar392,fVar379 * fVar253);
      auVar344._8_4_ = fVar398 * fVar241;
      auVar344._12_4_ = fVar409 * fVar280;
      auVar405._0_4_ = fVar379 * fVar350;
      auVar405._4_4_ = fVar393 * fVar308;
      auVar405._8_4_ = fVar398 * fVar368;
      auVar405._12_4_ = fVar409 * fVar330;
      auVar291._0_8_ = CONCAT44(fVar392 * fVar416,fVar253 * fVar413);
      auVar291._8_4_ = fVar241 * fVar390;
      auVar291._12_4_ = fVar280 * fVar254;
      auVar361._0_4_ = fVar350 * fVar413;
      auVar361._4_4_ = fVar308 * fVar416;
      auVar361._8_4_ = fVar368 * fVar390;
      auVar361._12_4_ = fVar330 * fVar254;
      auVar386._8_4_ = auVar344._8_4_;
      auVar386._0_8_ = auVar344._0_8_;
      auVar386._12_4_ = auVar344._12_4_;
      auVar125 = minps(auVar386,auVar405);
      auVar424._8_4_ = auVar291._8_4_;
      auVar424._0_8_ = auVar291._0_8_;
      auVar424._12_4_ = auVar291._12_4_;
      auVar262 = minps(auVar424,auVar361);
      auVar356 = minps(auVar125,auVar262);
      auVar262 = maxps(auVar405,auVar344);
      auVar125 = maxps(auVar361,auVar291);
      auVar184 = maxps(auVar125,auVar262);
      auVar345._8_4_ = auVar194._8_4_;
      auVar345._0_8_ = auVar194._0_8_;
      auVar345._12_4_ = auVar194._12_4_;
      auVar262 = minps(auVar345,auVar374);
      auVar292._8_4_ = auVar158._8_4_;
      auVar292._0_8_ = auVar158._0_8_;
      auVar292._12_4_ = auVar158._12_4_;
      auVar125 = minps(auVar292,auVar302);
      auVar262 = minps(auVar262,auVar125);
      auVar124 = maxps(auVar374,auVar194);
      auVar125 = maxps(auVar302,auVar158);
      auVar125 = maxps(auVar125,auVar124);
      auVar346._0_4_ = auVar356._4_4_ + auVar356._0_4_ + fVar299;
      auVar346._4_4_ = auVar262._4_4_ + auVar262._0_4_ + fVar282;
      auVar346._8_4_ = auVar356._8_4_ + auVar356._4_4_ + fVar295;
      auVar346._12_4_ = auVar356._12_4_ + auVar262._4_4_ + fVar301;
      fVar253 = auVar184._4_4_ + auVar184._0_4_ + fVar299;
      fVar254 = auVar125._4_4_ + auVar125._0_4_ + fVar282;
      auVar159._4_4_ = fVar254;
      auVar159._0_4_ = fVar253;
      auVar190 = maxps(_local_508,auVar346);
      auVar159._8_4_ = auVar184._8_4_ + auVar184._4_4_ + fVar295;
      auVar159._12_4_ = auVar184._12_4_ + auVar125._4_4_ + fVar301;
      auVar125 = minps(auVar159,auVar325);
      iVar205 = -(uint)(auVar125._0_4_ < auVar190._0_4_);
      iVar235 = -(uint)(auVar125._4_4_ < auVar190._4_4_);
      auVar160._4_4_ = iVar235;
      auVar160._0_4_ = iVar205;
      auVar160._8_4_ = iVar235;
      auVar160._12_4_ = iVar235;
      auVar162._8_8_ = auVar160._8_8_;
      auVar162._4_4_ = (float)iVar205;
      auVar162._0_4_ = (float)iVar205;
      iVar205 = movmskpd((uint)(fVar242 < 0.0),auVar162);
      auVar152 = _local_508;
      if (iVar205 == 0) {
        bVar105 = 0;
        if ((local_528.lower < auVar346._0_4_) && (fVar253 < local_528.upper)) {
          bVar105 = -(fVar254 < (float)local_538._4_4_) & (float)local_538._0_4_ < auVar346._4_4_;
        }
        bVar105 = bVar104 | bVar105;
        uVar108 = (ulong)CONCAT31(uVar43,bVar105);
        if (bVar105 != 1) goto LAB_003944d4;
        uVar108 = 0xc9;
        do {
          uVar108 = uVar108 - 1;
          if (uVar108 == 0) goto LAB_00394b45;
          fVar254 = 1.0 - fVar299;
          fVar242 = fVar299 * fVar299 * fVar299;
          fVar241 = fVar299 * fVar299 * 3.0 * fVar254;
          fVar253 = fVar254 * fVar254 * fVar254;
          fVar280 = fVar299 * 3.0 * fVar254 * fVar254;
          fVar254 = fVar253 * fVar396 + fVar280 * fVar327 + fVar241 * fVar259 + fVar242 * fVar349;
          fVar390 = fVar253 * fVar255 + fVar280 * fVar331 + fVar241 * fVar395 + fVar242 * fVar411;
          fVar392 = fVar253 * p00_1.field_0.v[2] +
                    fVar280 * fVar258 + fVar241 * p02.field_0.v[2] + fVar242 * fVar243;
          fVar241 = fVar253 * p00_1.field_0.v[3] +
                    fVar280 * fVar300 + fVar241 * p02.field_0.v[3] + fVar242 * fVar240;
          fVar242 = (fVar392 - fVar254) * fVar282;
          fVar280 = (fVar241 - fVar390) * fVar282;
          fVar253 = (fVar392 - fVar254) * fVar282 + fVar254;
          fVar392 = (fVar241 - fVar390) * fVar282 + fVar390;
          fVar299 = fVar299 - (fVar392 * fVar298 + fVar253 * fVar305);
          fVar282 = fVar282 - (fVar392 * fVar363 + fVar253 * fVar307);
          fVar241 = ABS(fVar392);
          auVar162._0_8_ = CONCAT44(fVar392,fVar253) & 0x7fffffff7fffffff;
          auVar162._8_4_ = ABS(fVar242 + fVar254);
          auVar162._12_4_ = ABS(fVar280 + fVar390);
          auVar190._0_8_ = CONCAT44(fVar392,fVar392) & 0x7fffffff7fffffff;
          auVar190._8_4_ = (int)fVar241;
          auVar190._12_4_ = (int)fVar241;
          if (fVar241 <= ABS(fVar253)) {
            auVar190._0_4_ = ABS(fVar253);
          }
        } while (fVar238 <= auVar190._0_4_);
        if ((((0.0 <= fVar299) && (fVar299 <= 1.0)) &&
            (auVar162._4_4_ = fVar282, auVar162._0_4_ = fVar282, auVar162._8_4_ = fVar282,
            auVar162._12_4_ = fVar282, 0.0 <= fVar282)) && (fVar282 <= 1.0)) {
          fVar253 = pre->ray_space[k].vx.field_0.m128[2];
          fVar254 = pre->ray_space[k].vy.field_0.m128[2];
          fVar390 = pre->ray_space[k].vz.field_0.m128[2];
          auVar195._0_4_ = fVar337 * fVar253;
          auVar195._4_4_ = fVar347 * fVar254;
          auVar195._8_4_ = fVar406 * fVar390;
          auVar195._12_4_ =
               (((fVar446 - fVar446 * (fVar260 * fVar415 - fVar415 * fVar260) * fVar367) * fVar428 +
                (fVar335 - fVar335 * (fVar412 * fVar336 - fVar336 * fVar412) * fVar429) * fVar202) -
               0.0) * 0.0;
          auVar196._8_8_ = auVar195._8_8_;
          auVar196._0_8_ = auVar196._8_8_;
          auVar190._4_12_ = auVar196._4_12_;
          fVar295 = 1.0 - fVar282;
          fVar350 = 1.0 - fVar299;
          fVar392 = fVar350 * fVar350 * fVar350;
          fVar241 = fVar299 * 3.0 * fVar350 * fVar350;
          fVar280 = fVar299 * fVar299 * fVar299;
          fVar242 = fVar299 * fVar299 * 3.0 * fVar350;
          auVar190._0_4_ =
               ((auVar195._8_4_ + auVar195._4_4_ + auVar195._0_4_) * fVar295 +
               (fVar304 * fVar390 + fVar281 * fVar254 + fVar408 * fVar253) * fVar282) * fVar392 +
               ((fVar414 * fVar390 + fVar362 * fVar254 + fVar387 * fVar253) * fVar295 +
               (fVar306 * fVar390 + fVar279 * fVar254 + fVar278 * fVar253) * fVar282) * fVar241 +
               ((fVar417 * fVar390 + fVar364 * fVar254 + fVar257 * fVar253) * fVar295 +
               (fVar333 * fVar390 + fVar329 * fVar254 + fVar309 * fVar253) * fVar282) * fVar242 +
               (fVar295 * (fVar425 * fVar390 + fVar407 * fVar254 + fVar348 * fVar253) +
               (fVar390 * fVar207 + fVar254 * fVar200 + fVar253 * fVar167) * fVar282) * fVar280;
          if ((fVar244 <= auVar190._0_4_) &&
             (fVar253 = *(float *)(pRVar113 + k * 4 + 0x80), auVar190._0_4_ <= fVar253)) {
            fVar298 = 1.0 - fVar282;
            fVar363 = 1.0 - fVar282;
            fVar301 = 1.0 - fVar282;
            fVar254 = fVar311 * fVar298 + fVar245 * fVar282;
            fVar390 = fVar328 * fVar363 + fVar261 * fVar282;
            fVar295 = fVar332 * fVar301 + fVar438 * fVar282;
            fVar305 = fVar397 * fVar298 + fVar256 * fVar282;
            fVar308 = fVar418 * fVar363 + fVar296 * fVar282;
            fVar330 = fVar427 * fVar301 + fVar394 * fVar282;
            fVar307 = fVar305 - fVar254;
            fVar368 = fVar308 - fVar390;
            fVar334 = fVar330 - fVar295;
            fVar254 = (((fVar254 - (fVar294 * fVar298 + fVar439 * fVar282)) * fVar350 +
                       fVar299 * fVar307) * fVar350 +
                      (fVar307 * fVar350 +
                      ((fVar298 * fVar206 + fVar449 * fVar282) - fVar305) * fVar299) * fVar299) *
                      3.0;
            fVar390 = (((fVar390 - (fVar297 * fVar363 + fVar447 * fVar282)) * fVar350 +
                       fVar299 * fVar368) * fVar350 +
                      (fVar368 * fVar350 +
                      ((fVar363 * fVar303 + fVar452 * fVar282) - fVar308) * fVar299) * fVar299) *
                      3.0;
            fVar350 = (((fVar295 - (fVar310 * fVar301 + fVar450 * fVar282)) * fVar350 +
                       fVar299 * fVar334) * fVar350 +
                      (fVar334 * fVar350 +
                      ((fVar301 * fVar326 + fVar203 * fVar282) - fVar330) * fVar299) * fVar299) *
                      3.0;
            pGVar28 = (context->scene->geometries).items[uVar117].ptr;
            if ((pGVar28->mask & *(uint *)(pRVar113 + k * 4 + 0x90)) == 0) {
              uVar108 = 0;
            }
            else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                    (uVar108 = CONCAT71((int7)((ulong)context->args >> 8),1),
                    pGVar28->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
              fVar282 = fVar392 * (fVar439 - fVar294) +
                        fVar241 * (fVar245 - fVar311) +
                        fVar242 * (fVar256 - fVar397) + fVar280 * (fVar449 - fVar206);
              fVar295 = fVar392 * (fVar447 - fVar297) +
                        fVar241 * (fVar261 - fVar328) +
                        fVar242 * (fVar296 - fVar418) + fVar280 * (fVar452 - fVar303);
              fVar392 = fVar392 * (fVar450 - fVar310) +
                        fVar241 * (fVar438 - fVar332) +
                        fVar242 * (fVar394 - fVar427) + fVar280 * (fVar203 - fVar326);
              local_c8 = fVar295 * fVar254 - fVar390 * fVar282;
              local_e8 = fVar392 * fVar390 - fVar350 * fVar295;
              local_d8 = fVar282 * fVar350 - fVar254 * fVar392;
              fStack_e4 = local_e8;
              fStack_e0 = local_e8;
              fStack_dc = local_e8;
              fStack_d4 = local_d8;
              fStack_d0 = local_d8;
              fStack_cc = local_d8;
              fStack_c4 = local_c8;
              fStack_c0 = local_c8;
              fStack_bc = local_c8;
              local_b8 = fVar299;
              fStack_b4 = fVar299;
              fStack_b0 = fVar299;
              fStack_ac = fVar299;
              local_a8 = auVar162;
              local_98 = CONCAT44(uVar118,uVar118);
              uStack_90 = CONCAT44(uVar118,uVar118);
              local_88 = CONCAT44(uVar117,uVar117);
              uStack_80 = CONCAT44(uVar117,uVar117);
              local_78 = context->user->instID[0];
              uStack_74 = local_78;
              uStack_70 = local_78;
              uStack_6c = local_78;
              local_68 = context->user->instPrimID[0];
              uStack_64 = local_68;
              uStack_60 = local_68;
              uStack_5c = local_68;
              *(float *)(pRVar113 + k * 4 + 0x80) = auVar190._0_4_;
              local_3a8 = *local_398;
              args.valid = (int *)local_3a8;
              args.geometryUserPtr = pGVar28->userPtr;
              args.context = context->user;
              args.ray = (RTCRayN *)pRVar113;
              args.hit = (RTCHitN *)&local_e8;
              args.N = 4;
              p_Var109 = pGVar28->occlusionFilterN;
              if (p_Var109 != (RTCFilterFunctionN)0x0) {
                p_Var109 = (RTCFilterFunctionN)(*p_Var109)(&args);
                pRVar113 = local_4f8;
              }
              auVar197._0_4_ = -(uint)(local_3a8._0_4_ == 0);
              auVar197._4_4_ = -(uint)(local_3a8._4_4_ == 0);
              auVar197._8_4_ = -(uint)(local_3a8._8_4_ == 0);
              auVar197._12_4_ = -(uint)(local_3a8._12_4_ == 0);
              uVar106 = movmskps((int)p_Var109,auVar197);
              pRVar110 = (RTCRayN *)(ulong)(uVar106 ^ 0xf);
              if ((uVar106 ^ 0xf) == 0) {
                auVar197 = auVar197 ^ _DAT_01f46b70;
                auVar162 = local_3a8;
              }
              else {
                p_Var109 = context->args->filter;
                if ((p_Var109 != (RTCFilterFunctionN)0x0) &&
                   (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar28->field_8).field_0x2 & 0x40) != 0)))
                   ) {
                  (*p_Var109)(&args);
                  pRVar113 = local_4f8;
                }
                auVar161._0_4_ = -(uint)(local_3a8._0_4_ == 0);
                auVar161._4_4_ = -(uint)(local_3a8._4_4_ == 0);
                auVar161._8_4_ = -(uint)(local_3a8._8_4_ == 0);
                auVar161._12_4_ = -(uint)(local_3a8._12_4_ == 0);
                auVar197 = auVar161 ^ _DAT_01f46b70;
                auVar162 = ~auVar161 & _DAT_01f45a40 |
                           *(undefined1 (*) [16])(args.ray + 0x80) & auVar161;
                *(undefined1 (*) [16])(args.ray + 0x80) = auVar162;
                pRVar110 = args.ray;
              }
              auVar190._0_4_ = (float)(auVar197._0_4_ << 0x1f);
              auVar190._4_4_ = auVar197._4_4_ << 0x1f;
              auVar190._8_4_ = auVar197._8_4_ << 0x1f;
              auVar190._12_4_ = auVar197._12_4_ << 0x1f;
              iVar205 = movmskps((int)pRVar110,auVar190);
              uVar108 = (ulong)CONCAT31((int3)((uint)iVar205 >> 8),iVar205 != 0);
              if (iVar205 == 0) {
                *(float *)(pRVar113 + k * 4 + 0x80) = fVar253;
              }
            }
            bVar111 = bVar111 | (byte)uVar108;
          }
        }
      }
    }
  }
  goto LAB_00394b45;
}

Assistant:

static __forceinline bool occluded_n(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          const Vec3fa ray_org(ray.org.x[k], ray.org.y[k], ray.org.z[k]);
          const TensorLinearCubicBezierSurface3fa curve = geom->getNormalOrientedCurve<typename Intersector::SourceCurve3ff, typename Intersector::SourceCurve3fa, TensorLinearCubicBezierSurface3fa>(context, ray_org, primID,ray.time()[k]);
          
          if (Intersector().intersect(pre,ray,k,context,geom,primID,curve,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }